

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 (*pauVar1) [12];
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [12];
  undefined4 uVar26;
  ulong uVar27;
  long lVar28;
  unsigned_long uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar33;
  float fVar57;
  float fVar58;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar59;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar60;
  float fVar61;
  float fVar81;
  float fVar82;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar66 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar83;
  float fVar84;
  float fVar100;
  float fVar102;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar101;
  float fVar103;
  float fVar106;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar105;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar104;
  float fVar107;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar114;
  float fVar115;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar116;
  float fVar117;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  float fVar126;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar130;
  Vec3fa n1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar147;
  float fVar148;
  vfloat4 b1_5;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar146 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  Vec3fa n0;
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar185;
  float fVar186;
  vfloat4 b0;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar187;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  vfloat4 b1_2;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  vfloat4 b1;
  float fVar197;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  size_t local_2d8;
  size_t local_2d0;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar29 = r->_begin;
  local_178._8_4_ = 0xff800000;
  local_178._0_8_ = 0xff800000ff800000;
  local_178._12_4_ = 0xff800000;
  local_2d8 = 0;
  auVar160 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  auVar168 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  local_168._8_4_ = 0x7f800000;
  local_168._0_8_ = 0x7f8000007f800000;
  local_168._12_4_ = 0x7f800000;
  local_188._8_4_ = 0x7f800000;
  local_188._0_8_ = 0x7f8000007f800000;
  local_188._12_4_ = 0x7f800000;
  local_2d0 = k;
  local_158 = local_178;
  do {
    if (r->_end <= uVar29) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
        field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               lower.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
        field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               upper.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_158._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_158._8_8_;
      __return_storage_ptr__->end = local_2d8;
      return __return_storage_ptr__;
    }
    pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                               super_CurveGeometry.field_0x68 * uVar29);
    uVar27 = (ulong)uVar4;
    uVar30 = (ulong)(uVar4 + 3);
    if (uVar30 < (pBVar5->super_RawBufferView).num) {
      uVar31 = (ulong)(uVar4 + 1);
      uVar32 = (ulong)(uVar4 + 2);
      pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               normals.items;
      fVar61 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               maxRadiusScale;
      lVar28 = 0;
      do {
        if ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 ==
            lVar28 + 0x38) {
          pcVar9 = (pBVar5->super_RawBufferView).ptr_ofs;
          sVar10 = (pBVar5->super_RawBufferView).stride;
          fVar61 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.maxRadiusScale;
          auVar38 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar27),
                                  ZEXT416((uint)(fVar61 * *(float *)(pcVar9 + sVar10 * uVar27 + 0xc)
                                                )),0x30);
          auVar42 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar31),
                                  ZEXT416((uint)(fVar61 * *(float *)(pcVar9 + sVar10 * uVar31 + 0xc)
                                                )),0x30);
          auVar46 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar32),
                                  ZEXT416((uint)(fVar61 * *(float *)(pcVar9 + sVar10 * uVar32 + 0xc)
                                                )),0x30);
          auVar43 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + sVar10 * uVar30),
                                  ZEXT416((uint)(fVar61 * *(float *)(pcVar9 + sVar10 * uVar30 + 0xc)
                                                )),0x30);
          fVar116 = auVar42._0_4_;
          fVar124 = auVar42._4_4_;
          fVar126 = auVar42._8_4_;
          fVar128 = auVar42._12_4_;
          fVar61 = auVar46._0_4_;
          fVar33 = auVar46._4_4_;
          fVar58 = auVar46._8_4_;
          fVar60 = auVar46._12_4_;
          fVar143 = auVar43._0_4_;
          fVar185 = auVar43._4_4_;
          fVar187 = auVar43._8_4_;
          fVar150 = auVar43._12_4_;
          auVar42._0_4_ = fVar116 * 0.0 + fVar61 * 0.5 + fVar143 * 0.0;
          auVar42._4_4_ = fVar124 * 0.0 + fVar33 * 0.5 + fVar185 * 0.0;
          auVar42._8_4_ = fVar126 * 0.0 + fVar58 * 0.5 + fVar187 * 0.0;
          auVar42._12_4_ = fVar128 * 0.0 + fVar60 * 0.5 + fVar150 * 0.0;
          fVar161 = auVar38._0_4_;
          auVar67._0_4_ = fVar161 * 0.5;
          fVar57 = auVar38._4_4_;
          auVar67._4_4_ = fVar57 * 0.5;
          fVar59 = auVar38._8_4_;
          auVar67._8_4_ = fVar59 * 0.5;
          fVar81 = auVar38._12_4_;
          auVar67._12_4_ = fVar81 * 0.5;
          auVar66 = vsubps_avx(auVar42,auVar67);
          auVar46 = vshufps_avx(auVar66,auVar66,0xc9);
          pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          pcVar9 = (pBVar6->super_RawBufferView).ptr_ofs;
          sVar10 = (pBVar6->super_RawBufferView).stride;
          pfVar3 = (float *)(pcVar9 + uVar27 * sVar10);
          fVar82 = *pfVar3;
          fVar104 = pfVar3[1];
          fVar107 = pfVar3[2];
          fVar114 = pfVar3[3];
          pfVar3 = (float *)(pcVar9 + uVar31 * sVar10);
          fVar115 = *pfVar3;
          fVar130 = pfVar3[1];
          fVar83 = pfVar3[2];
          fVar100 = pfVar3[3];
          pfVar3 = (float *)(pcVar9 + uVar32 * sVar10);
          fVar102 = *pfVar3;
          fVar105 = pfVar3[1];
          fVar147 = pfVar3[2];
          fVar148 = pfVar3[3];
          pauVar2 = (undefined1 (*) [16])(pcVar9 + sVar10 * uVar30);
          auVar72 = *pauVar2;
          fVar178 = *(float *)*pauVar2 * -0.0;
          fVar186 = *(float *)(*pauVar2 + 4) * -0.0;
          fVar149 = *(float *)(*pauVar2 + 8) * -0.0;
          fVar151 = *(float *)(*pauVar2 + 0xc) * -0.0;
          auVar38._0_4_ = fVar82 * -0.0 + fVar115 + fVar102 * 0.0 + fVar178;
          auVar38._4_4_ = fVar104 * -0.0 + fVar130 + fVar105 * 0.0 + fVar186;
          auVar38._8_4_ = fVar107 * -0.0 + fVar83 + fVar147 * 0.0 + fVar149;
          auVar38._12_4_ = fVar114 * -0.0 + fVar100 + fVar148 * 0.0 + fVar151;
          auVar45._0_4_ = auVar46._0_4_ * auVar38._0_4_;
          auVar45._4_4_ = auVar46._4_4_ * auVar38._4_4_;
          auVar45._8_4_ = auVar46._8_4_ * auVar38._8_4_;
          auVar45._12_4_ = auVar46._12_4_ * auVar38._12_4_;
          auVar38 = vshufps_avx(auVar38,auVar38,0xc9);
          fVar84 = auVar66._0_4_;
          auVar43._0_4_ = fVar84 * auVar38._0_4_;
          fVar101 = auVar66._4_4_;
          auVar43._4_4_ = fVar101 * auVar38._4_4_;
          fVar103 = auVar66._8_4_;
          auVar43._8_4_ = fVar103 * auVar38._8_4_;
          fVar106 = auVar66._12_4_;
          auVar43._12_4_ = fVar106 * auVar38._12_4_;
          auVar38 = vsubps_avx(auVar45,auVar43);
          auVar43 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar38 = vdpps_avx(auVar43,auVar43,0x7f);
          fVar117 = auVar38._0_4_;
          auVar68._4_12_ = ZEXT812(0) << 0x20;
          auVar68._0_4_ = fVar117;
          auVar42 = vrsqrtss_avx(auVar68,auVar68);
          fVar125 = auVar42._0_4_;
          auVar196._0_4_ = fVar115 * 0.0 + *(float *)*pauVar2 * 0.0 + fVar102 * 0.5;
          auVar196._4_4_ = fVar130 * 0.0 + *(float *)(*pauVar2 + 4) * 0.0 + fVar105 * 0.5;
          auVar196._8_4_ = fVar83 * 0.0 + *(float *)(*pauVar2 + 8) * 0.0 + fVar147 * 0.5;
          auVar196._12_4_ = fVar100 * 0.0 + *(float *)(*pauVar2 + 0xc) * 0.0 + fVar148 * 0.5;
          auVar179._0_4_ = fVar82 * 0.5;
          auVar179._4_4_ = fVar104 * 0.5;
          auVar179._8_4_ = fVar107 * 0.5;
          auVar179._12_4_ = fVar114 * 0.5;
          auVar42 = vsubps_avx(auVar196,auVar179);
          auVar192._0_4_ = auVar46._0_4_ * auVar42._0_4_;
          auVar192._4_4_ = auVar46._4_4_ * auVar42._4_4_;
          auVar192._8_4_ = auVar46._8_4_ * auVar42._8_4_;
          auVar192._12_4_ = auVar46._12_4_ * auVar42._12_4_;
          auVar42 = vshufps_avx(auVar42,auVar42,0xc9);
          auVar180._0_4_ = auVar42._0_4_ * fVar84;
          auVar180._4_4_ = auVar42._4_4_ * fVar101;
          auVar180._8_4_ = auVar42._8_4_ * fVar103;
          auVar180._12_4_ = auVar42._12_4_ * fVar106;
          auVar42 = vsubps_avx(auVar192,auVar180);
          auVar42 = vshufps_avx(auVar42,auVar42,0xc9);
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          auVar193._0_4_ = auVar38._0_4_ * auVar42._0_4_;
          auVar193._4_4_ = auVar38._4_4_ * auVar42._4_4_;
          auVar193._8_4_ = auVar38._8_4_ * auVar42._8_4_;
          auVar193._12_4_ = auVar38._12_4_ * auVar42._12_4_;
          auVar38 = vdpps_avx(auVar43,auVar42,0x7f);
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          auVar181._0_4_ = auVar38._0_4_ * auVar43._0_4_;
          auVar181._4_4_ = auVar38._4_4_ * auVar43._4_4_;
          auVar181._8_4_ = auVar38._8_4_ * auVar43._8_4_;
          auVar181._12_4_ = auVar38._12_4_ * auVar43._12_4_;
          auVar67 = vsubps_avx(auVar193,auVar181);
          auVar38 = vrcpss_avx(auVar68,auVar68);
          auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar117 * auVar38._0_4_)));
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          auVar42 = ZEXT416((uint)(fVar125 * 1.5 - fVar125 * fVar125 * fVar117 * 0.5 * fVar125));
          auVar42 = vshufps_avx(auVar42,auVar42,0);
          fVar117 = auVar43._0_4_ * auVar42._0_4_;
          fVar125 = auVar43._4_4_ * auVar42._4_4_;
          fVar127 = auVar43._8_4_ * auVar42._8_4_;
          fVar129 = auVar43._12_4_ * auVar42._12_4_;
          auVar44._0_4_ = fVar161 * -0.0 + fVar116 + fVar143 * -0.0 + fVar61 * 0.0;
          auVar44._4_4_ = fVar57 * -0.0 + fVar124 + fVar185 * -0.0 + fVar33 * 0.0;
          auVar44._8_4_ = fVar59 * -0.0 + fVar126 + fVar187 * -0.0 + fVar58 * 0.0;
          auVar44._12_4_ = fVar81 * -0.0 + fVar128 + fVar150 * -0.0 + fVar60 * 0.0;
          auVar46 = vshufps_avx(auVar66,auVar66,0xff);
          auVar43 = vshufps_avx(auVar44,auVar44,0xff);
          local_1a8._0_4_ = auVar43._0_4_ * fVar117;
          local_1a8._4_4_ = auVar43._4_4_ * fVar125;
          fStack_1a0 = auVar43._8_4_ * fVar127;
          fStack_19c = auVar43._12_4_ * fVar129;
          local_318._0_4_ =
               auVar46._0_4_ * fVar117 +
               auVar42._0_4_ * auVar67._0_4_ * auVar38._0_4_ * auVar43._0_4_;
          local_318._4_4_ =
               auVar46._4_4_ * fVar125 +
               auVar42._4_4_ * auVar67._4_4_ * auVar38._4_4_ * auVar43._4_4_;
          fStack_310 = auVar46._8_4_ * fVar127 +
                       auVar42._8_4_ * auVar67._8_4_ * auVar38._8_4_ * auVar43._8_4_;
          fStack_30c = auVar46._12_4_ * fVar129 +
                       auVar42._12_4_ * auVar67._12_4_ * auVar38._12_4_ * auVar43._12_4_;
          auVar69._0_4_ = fVar61 * 0.0 + fVar143 * 0.5;
          auVar69._4_4_ = fVar33 * 0.0 + fVar185 * 0.5;
          auVar69._8_4_ = fVar58 * 0.0 + fVar187 * 0.5;
          auVar69._12_4_ = fVar60 * 0.0 + fVar150 * 0.5;
          auVar118._0_4_ = fVar116 * 0.5;
          auVar118._4_4_ = fVar124 * 0.5;
          auVar118._8_4_ = fVar126 * 0.5;
          auVar118._12_4_ = fVar128 * 0.5;
          auVar38 = vsubps_avx(auVar69,auVar118);
          auVar136._0_4_ = fVar161 * 0.0 + auVar38._0_4_;
          auVar136._4_4_ = fVar57 * 0.0 + auVar38._4_4_;
          auVar136._8_4_ = fVar59 * 0.0 + auVar38._8_4_;
          auVar136._12_4_ = fVar81 * 0.0 + auVar38._12_4_;
          auVar46 = vshufps_avx(auVar136,auVar136,0xc9);
          auVar70._0_4_ = fVar115 * 0.0 + fVar102 + fVar178 + fVar82 * -0.0;
          auVar70._4_4_ = fVar130 * 0.0 + fVar105 + fVar186 + fVar104 * -0.0;
          auVar70._8_4_ = fVar83 * 0.0 + fVar147 + fVar149 + fVar107 * -0.0;
          auVar70._12_4_ = fVar100 * 0.0 + fVar148 + fVar151 + fVar114 * -0.0;
          auVar89._0_4_ = auVar46._0_4_ * auVar70._0_4_;
          auVar89._4_4_ = auVar46._4_4_ * auVar70._4_4_;
          auVar89._8_4_ = auVar46._8_4_ * auVar70._8_4_;
          auVar89._12_4_ = auVar46._12_4_ * auVar70._12_4_;
          auVar38 = vshufps_avx(auVar70,auVar70,0xc9);
          auVar71._0_4_ = auVar136._0_4_ * auVar38._0_4_;
          auVar71._4_4_ = auVar136._4_4_ * auVar38._4_4_;
          auVar71._8_4_ = auVar136._8_4_ * auVar38._8_4_;
          auVar71._12_4_ = auVar136._12_4_ * auVar38._12_4_;
          auVar38 = vsubps_avx(auVar89,auVar71);
          auVar43 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar38 = vdpps_avx(auVar43,auVar43,0x7f);
          auVar154._0_4_ = fVar161 * -0.0 + fVar143 * -0.0 + fVar61 + fVar116 * 0.0;
          auVar154._4_4_ = fVar57 * -0.0 + fVar185 * -0.0 + fVar33 + fVar124 * 0.0;
          auVar154._8_4_ = fVar59 * -0.0 + fVar187 * -0.0 + fVar58 + fVar126 * 0.0;
          auVar154._12_4_ = fVar81 * -0.0 + fVar150 * -0.0 + fVar60 + fVar128 * 0.0;
          fVar61 = auVar38._0_4_;
          auVar45 = ZEXT416((uint)fVar61);
          auVar42 = vrsqrtss_avx(auVar45,auVar45);
          fVar161 = auVar42._0_4_;
          auVar42 = vshufps_avx(auVar154,auVar154,0xff);
          auVar67 = ZEXT416((uint)(fVar161 * 1.5 - fVar161 * fVar161 * fVar61 * 0.5 * fVar161));
          auVar67 = vshufps_avx(auVar67,auVar67,0);
          local_248 = auVar72._0_4_;
          fStack_244 = auVar72._4_4_;
          fStack_240 = auVar72._8_4_;
          fStack_23c = auVar72._12_4_;
          auVar155._0_4_ = local_248 * 0.5 + fVar102 * 0.0;
          auVar155._4_4_ = fStack_244 * 0.5 + fVar105 * 0.0;
          auVar155._8_4_ = fStack_240 * 0.5 + fVar147 * 0.0;
          auVar155._12_4_ = fStack_23c * 0.5 + fVar148 * 0.0;
          fVar161 = auVar43._0_4_ * auVar67._0_4_;
          fVar33 = auVar43._4_4_ * auVar67._4_4_;
          fVar57 = auVar43._8_4_ * auVar67._8_4_;
          fVar58 = auVar43._12_4_ * auVar67._12_4_;
          auVar169._0_4_ = fVar115 * 0.5;
          auVar169._4_4_ = fVar130 * 0.5;
          auVar169._8_4_ = fVar83 * 0.5;
          auVar169._12_4_ = fVar100 * 0.5;
          auVar47 = vsubps_avx(auVar155,auVar169);
          auVar72 = vshufps_avx(auVar136,auVar136,0xff);
          local_128._0_4_ = fVar161 * auVar42._0_4_;
          local_128._4_4_ = fVar33 * auVar42._4_4_;
          fStack_120 = fVar57 * auVar42._8_4_;
          fStack_11c = fVar58 * auVar42._12_4_;
          auVar156._0_4_ = fVar82 * 0.0 + auVar47._0_4_;
          auVar156._4_4_ = fVar104 * 0.0 + auVar47._4_4_;
          auVar156._8_4_ = fVar107 * 0.0 + auVar47._8_4_;
          auVar156._12_4_ = fVar114 * 0.0 + auVar47._12_4_;
          auVar47 = vshufps_avx(auVar38,auVar38,0);
          auVar119._0_4_ = auVar46._0_4_ * auVar156._0_4_;
          auVar119._4_4_ = auVar46._4_4_ * auVar156._4_4_;
          auVar119._8_4_ = auVar46._8_4_ * auVar156._8_4_;
          auVar119._12_4_ = auVar46._12_4_ * auVar156._12_4_;
          auVar38 = vshufps_avx(auVar156,auVar156,0xc9);
          auVar157._0_4_ = auVar136._0_4_ * auVar38._0_4_;
          auVar157._4_4_ = auVar136._4_4_ * auVar38._4_4_;
          auVar157._8_4_ = auVar136._8_4_ * auVar38._8_4_;
          auVar157._12_4_ = auVar136._12_4_ * auVar38._12_4_;
          auVar38 = vsubps_avx(auVar119,auVar157);
          auVar46 = vshufps_avx(auVar38,auVar38,0xc9);
          auVar38 = vdpps_avx(auVar43,auVar46,0x7f);
          auVar120._0_4_ = auVar47._0_4_ * auVar46._0_4_;
          auVar120._4_4_ = auVar47._4_4_ * auVar46._4_4_;
          auVar120._8_4_ = auVar47._8_4_ * auVar46._8_4_;
          auVar120._12_4_ = auVar47._12_4_ * auVar46._12_4_;
          auVar166._0_4_ = auVar154._0_4_ + (float)local_128._0_4_;
          auVar166._4_4_ = auVar154._4_4_ + (float)local_128._4_4_;
          auVar166._8_4_ = auVar154._8_4_ + fStack_120;
          auVar166._12_4_ = auVar154._12_4_ + fStack_11c;
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          auVar90._0_4_ = auVar38._0_4_ * auVar43._0_4_;
          auVar90._4_4_ = auVar38._4_4_ * auVar43._4_4_;
          auVar90._8_4_ = auVar38._8_4_ * auVar43._8_4_;
          auVar90._12_4_ = auVar38._12_4_ * auVar43._12_4_;
          auVar46 = vsubps_avx(auVar120,auVar90);
          auVar38 = vrcpss_avx(auVar45,auVar45);
          auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar61 * auVar38._0_4_)));
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          local_358._0_4_ =
               auVar72._0_4_ * fVar161 +
               auVar42._0_4_ * auVar67._0_4_ * auVar46._0_4_ * auVar38._0_4_;
          local_358._4_4_ =
               auVar72._4_4_ * fVar33 +
               auVar42._4_4_ * auVar67._4_4_ * auVar46._4_4_ * auVar38._4_4_;
          fStack_350 = auVar72._8_4_ * fVar57 +
                       auVar42._8_4_ * auVar67._8_4_ * auVar46._8_4_ * auVar38._8_4_;
          fStack_34c = auVar72._12_4_ * fVar58 +
                       auVar42._12_4_ * auVar67._12_4_ * auVar46._12_4_ * auVar38._12_4_;
          auVar46._0_4_ = (auVar136._0_4_ + (float)local_358._0_4_) * 0.33333334;
          auVar46._4_4_ = (auVar136._4_4_ + (float)local_358._4_4_) * 0.33333334;
          auVar46._8_4_ = (auVar136._8_4_ + fStack_350) * 0.33333334;
          auVar46._12_4_ = (auVar136._12_4_ + fStack_34c) * 0.33333334;
          auVar46 = vsubps_avx(auVar166,auVar46);
          auVar38 = vshufps_avx(auVar46,auVar46,0xaa);
          fVar57 = auVar38._0_4_;
          fVar58 = auVar38._4_4_;
          fVar59 = auVar38._8_4_;
          fVar60 = auVar38._12_4_;
          auVar38 = vshufps_avx(auVar166,auVar166,0xaa);
          fVar81 = auVar38._0_4_;
          fVar82 = auVar38._4_4_;
          fVar104 = auVar38._8_4_;
          fVar107 = auVar38._12_4_;
          auVar137._0_4_ = (float)local_1a8._0_4_ + auVar44._0_4_;
          auVar137._4_4_ = (float)local_1a8._4_4_ + auVar44._4_4_;
          auVar137._8_4_ = fStack_1a0 + auVar44._8_4_;
          auVar137._12_4_ = fStack_19c + auVar44._12_4_;
          auVar72._0_4_ = auVar137._0_4_ + (fVar84 + (float)local_318._0_4_) * 0.33333334;
          auVar72._4_4_ = auVar137._4_4_ + (fVar101 + (float)local_318._4_4_) * 0.33333334;
          auVar72._8_4_ = auVar137._8_4_ + (fVar103 + fStack_310) * 0.33333334;
          auVar72._12_4_ = auVar137._12_4_ + (fVar106 + fStack_30c) * 0.33333334;
          auVar38 = vshufps_avx(auVar72,auVar72,0xaa);
          fVar61 = auVar38._0_4_;
          fVar161 = auVar38._4_4_;
          fVar33 = auVar38._8_4_;
          auVar42 = vshufps_avx(auVar137,auVar137,0xaa);
          fVar114 = auVar42._0_4_;
          fVar115 = auVar42._4_4_;
          fVar130 = auVar42._8_4_;
          auVar110._0_4_ =
               fVar114 * (float)bezier_basis0._476_4_ +
               (float)bezier_basis0._1632_4_ * fVar61 +
               fVar57 * (float)bezier_basis0._2788_4_ + fVar81 * (float)bezier_basis0._3944_4_;
          auVar110._4_4_ =
               fVar115 * (float)bezier_basis0._480_4_ +
               (float)bezier_basis0._1636_4_ * fVar161 +
               fVar58 * (float)bezier_basis0._2792_4_ + fVar82 * (float)bezier_basis0._3948_4_;
          auVar110._8_4_ =
               fVar130 * (float)bezier_basis0._484_4_ +
               (float)bezier_basis0._1640_4_ * fVar33 +
               fVar59 * (float)bezier_basis0._2796_4_ + fVar104 * (float)bezier_basis0._3952_4_;
          auVar110._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._488_4_ +
               (float)bezier_basis0._1644_4_ * auVar38._12_4_ +
               fVar60 * (float)bezier_basis0._2800_4_ + fVar107 * (float)bezier_basis0._3956_4_;
          auVar110._16_4_ =
               fVar114 * (float)bezier_basis0._492_4_ +
               (float)bezier_basis0._1648_4_ * fVar61 +
               fVar57 * (float)bezier_basis0._2804_4_ + fVar81 * (float)bezier_basis0._3960_4_;
          auVar110._20_4_ =
               fVar115 * (float)bezier_basis0._496_4_ +
               (float)bezier_basis0._1652_4_ * fVar161 +
               fVar58 * (float)bezier_basis0._2808_4_ + fVar82 * (float)bezier_basis0._3964_4_;
          auVar110._24_4_ =
               fVar130 * (float)bezier_basis0._500_4_ +
               (float)bezier_basis0._1656_4_ * fVar33 +
               fVar59 * (float)bezier_basis0._2812_4_ + fVar104 * (float)bezier_basis0._3968_4_;
          auVar110._28_4_ =
               (float)bezier_basis0._1660_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
          auVar53._0_4_ =
               fVar114 * (float)bezier_basis0._5100_4_ +
               fVar61 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar57 + fVar81 * (float)bezier_basis0._8568_4_;
          auVar53._4_4_ =
               fVar115 * (float)bezier_basis0._5104_4_ +
               fVar161 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar58 + fVar82 * (float)bezier_basis0._8572_4_;
          auVar53._8_4_ =
               fVar130 * (float)bezier_basis0._5108_4_ +
               fVar33 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar59 + fVar104 * (float)bezier_basis0._8576_4_;
          auVar53._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar38._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar60 + fVar107 * (float)bezier_basis0._8580_4_;
          auVar53._16_4_ =
               fVar114 * (float)bezier_basis0._5116_4_ +
               fVar61 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar57 + fVar81 * (float)bezier_basis0._8584_4_;
          auVar53._20_4_ =
               fVar115 * (float)bezier_basis0._5120_4_ +
               fVar161 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar58 + fVar82 * (float)bezier_basis0._8588_4_;
          auVar53._24_4_ =
               fVar130 * (float)bezier_basis0._5124_4_ +
               fVar33 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar59 + fVar104 * (float)bezier_basis0._8592_4_;
          auVar53._28_4_ = fVar107 + fVar107 + fVar60 + fVar107;
          auVar54 = vblendps_avx(auVar53,ZEXT832(0) << 0x20,1);
          auVar13._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar13._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar13._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar13._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar13._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar13._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar13._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar13._28_4_ = auVar54._28_4_;
          auVar16 = vsubps_avx(auVar110,auVar13);
          auVar54 = vblendps_avx(auVar53,ZEXT832(0) << 0x20,0x80);
          auVar95._0_4_ = auVar110._0_4_ + auVar54._0_4_ * 0.055555556;
          auVar95._4_4_ = auVar110._4_4_ + auVar54._4_4_ * 0.055555556;
          auVar95._8_4_ = auVar110._8_4_ + auVar54._8_4_ * 0.055555556;
          auVar95._12_4_ = auVar110._12_4_ + auVar54._12_4_ * 0.055555556;
          auVar95._16_4_ = auVar110._16_4_ + auVar54._16_4_ * 0.055555556;
          auVar95._20_4_ = auVar110._20_4_ + auVar54._20_4_ * 0.055555556;
          auVar95._24_4_ = auVar110._24_4_ + auVar54._24_4_ * 0.055555556;
          auVar95._28_4_ = auVar110._28_4_ + auVar54._28_4_;
          auVar54._8_4_ = 0xff800000;
          auVar54._0_8_ = 0xff800000ff800000;
          auVar54._12_4_ = 0xff800000;
          auVar54._16_4_ = 0xff800000;
          auVar54._20_4_ = 0xff800000;
          auVar54._24_4_ = 0xff800000;
          auVar54._28_4_ = 0xff800000;
          auVar54 = vmaxps_avx(auVar54,auVar110);
          auVar13 = vmaxps_avx(auVar16,auVar95);
          auVar13 = vmaxps_avx(auVar54,auVar13);
          auVar38 = vshufps_avx(auVar46,auVar46,0x55);
          auVar42 = vshufps_avx(auVar166,auVar166,0x55);
          fVar61 = auVar38._0_4_;
          fVar161 = auVar38._4_4_;
          fVar33 = auVar38._8_4_;
          fVar57 = auVar38._12_4_;
          fVar58 = auVar42._0_4_;
          fVar59 = auVar42._4_4_;
          fVar60 = auVar42._8_4_;
          fVar81 = auVar42._12_4_;
          auVar38 = vshufps_avx(auVar72,auVar72,0x55);
          fVar82 = auVar38._0_4_;
          fVar104 = auVar38._4_4_;
          fVar107 = auVar38._8_4_;
          auVar42 = vshufps_avx(auVar137,auVar137,0x55);
          fVar114 = auVar42._0_4_;
          fVar115 = auVar42._4_4_;
          fVar130 = auVar42._8_4_;
          auVar55._0_4_ =
               fVar114 * (float)bezier_basis0._476_4_ +
               fVar82 * (float)bezier_basis0._1632_4_ +
               fVar58 * (float)bezier_basis0._3944_4_ + (float)bezier_basis0._2788_4_ * fVar61;
          auVar55._4_4_ =
               fVar115 * (float)bezier_basis0._480_4_ +
               fVar104 * (float)bezier_basis0._1636_4_ +
               fVar59 * (float)bezier_basis0._3948_4_ + (float)bezier_basis0._2792_4_ * fVar161;
          auVar55._8_4_ =
               fVar130 * (float)bezier_basis0._484_4_ +
               fVar107 * (float)bezier_basis0._1640_4_ +
               fVar60 * (float)bezier_basis0._3952_4_ + (float)bezier_basis0._2796_4_ * fVar33;
          auVar55._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._488_4_ +
               auVar38._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar81 * (float)bezier_basis0._3956_4_ + (float)bezier_basis0._2800_4_ * fVar57;
          auVar55._16_4_ =
               fVar114 * (float)bezier_basis0._492_4_ +
               fVar82 * (float)bezier_basis0._1648_4_ +
               fVar58 * (float)bezier_basis0._3960_4_ + (float)bezier_basis0._2804_4_ * fVar61;
          auVar55._20_4_ =
               fVar115 * (float)bezier_basis0._496_4_ +
               fVar104 * (float)bezier_basis0._1652_4_ +
               fVar59 * (float)bezier_basis0._3964_4_ + (float)bezier_basis0._2808_4_ * fVar161;
          auVar55._24_4_ =
               fVar130 * (float)bezier_basis0._500_4_ +
               fVar107 * (float)bezier_basis0._1656_4_ +
               fVar60 * (float)bezier_basis0._3968_4_ + (float)bezier_basis0._2812_4_ * fVar33;
          auVar55._28_4_ =
               (float)bezier_basis0._1660_4_ +
               (float)bezier_basis0._1660_4_ + (float)bezier_basis0._2816_4_ + 0.0;
          auVar96._0_4_ =
               fVar114 * (float)bezier_basis0._5100_4_ +
               fVar82 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar61 + fVar58 * (float)bezier_basis0._8568_4_;
          auVar96._4_4_ =
               fVar115 * (float)bezier_basis0._5104_4_ +
               fVar104 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar161 + fVar59 * (float)bezier_basis0._8572_4_;
          auVar96._8_4_ =
               fVar130 * (float)bezier_basis0._5108_4_ +
               fVar107 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar33 + fVar60 * (float)bezier_basis0._8576_4_;
          auVar96._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar38._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar57 + fVar81 * (float)bezier_basis0._8580_4_;
          auVar96._16_4_ =
               fVar114 * (float)bezier_basis0._5116_4_ +
               fVar82 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar61 + fVar58 * (float)bezier_basis0._8584_4_;
          auVar96._20_4_ =
               fVar115 * (float)bezier_basis0._5120_4_ +
               fVar104 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar161 + fVar59 * (float)bezier_basis0._8588_4_;
          auVar96._24_4_ =
               fVar130 * (float)bezier_basis0._5124_4_ +
               fVar107 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar33 + fVar60 * (float)bezier_basis0._8592_4_;
          auVar96._28_4_ = fVar81 + fVar81 + fVar57 + fVar81;
          auVar54 = vblendps_avx(auVar96,ZEXT432(0) << 0x20,1);
          auVar14._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar14._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar14._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar14._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar14._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar14._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar14._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar14._28_4_ = auVar54._28_4_;
          auVar17 = vsubps_avx(auVar55,auVar14);
          auVar54 = vblendps_avx(auVar96,ZEXT432(0) << 0x20,0x80);
          auVar97._0_4_ = auVar55._0_4_ + auVar54._0_4_ * 0.055555556;
          auVar97._4_4_ = auVar55._4_4_ + auVar54._4_4_ * 0.055555556;
          auVar97._8_4_ = auVar55._8_4_ + auVar54._8_4_ * 0.055555556;
          auVar97._12_4_ = auVar55._12_4_ + auVar54._12_4_ * 0.055555556;
          auVar97._16_4_ = auVar55._16_4_ + auVar54._16_4_ * 0.055555556;
          auVar97._20_4_ = auVar55._20_4_ + auVar54._20_4_ * 0.055555556;
          auVar97._24_4_ = auVar55._24_4_ + auVar54._24_4_ * 0.055555556;
          auVar97._28_4_ = auVar55._28_4_ + auVar54._28_4_;
          auVar159._8_4_ = 0xff800000;
          auVar159._0_8_ = 0xff800000ff800000;
          auVar159._12_4_ = 0xff800000;
          auVar159._16_4_ = 0xff800000;
          auVar159._20_4_ = 0xff800000;
          auVar159._24_4_ = 0xff800000;
          auVar159._28_4_ = 0xff800000;
          auVar54 = vmaxps_avx(auVar159,auVar55);
          auVar14 = vmaxps_avx(auVar17,auVar97);
          auVar53 = vmaxps_avx(auVar54,auVar14);
          auVar42 = vpermilps_avx(auVar46,0);
          auVar38 = vshufps_avx(auVar166,auVar166,0);
          fVar82 = auVar42._0_4_;
          fVar104 = auVar42._4_4_;
          fVar107 = auVar42._8_4_;
          fVar114 = auVar42._12_4_;
          fVar115 = auVar38._0_4_;
          fVar130 = auVar38._4_4_;
          fVar83 = auVar38._8_4_;
          fVar100 = auVar38._12_4_;
          auVar38 = vshufps_avx(auVar72,auVar72,0);
          fVar58 = auVar38._0_4_;
          fVar59 = auVar38._4_4_;
          fVar60 = auVar38._8_4_;
          fVar81 = auVar38._12_4_;
          auVar38 = vshufps_avx(auVar137,auVar137,0);
          fVar61 = auVar38._0_4_;
          fVar161 = auVar38._4_4_;
          fVar33 = auVar38._8_4_;
          fVar57 = auVar38._12_4_;
          auVar184._0_4_ =
               (float)bezier_basis0._476_4_ * fVar61 +
               fVar58 * (float)bezier_basis0._1632_4_ +
               fVar82 * (float)bezier_basis0._2788_4_ + fVar115 * (float)bezier_basis0._3944_4_;
          auVar184._4_4_ =
               (float)bezier_basis0._480_4_ * fVar161 +
               fVar59 * (float)bezier_basis0._1636_4_ +
               fVar104 * (float)bezier_basis0._2792_4_ + fVar130 * (float)bezier_basis0._3948_4_;
          auVar184._8_4_ =
               (float)bezier_basis0._484_4_ * fVar33 +
               fVar60 * (float)bezier_basis0._1640_4_ +
               fVar107 * (float)bezier_basis0._2796_4_ + fVar83 * (float)bezier_basis0._3952_4_;
          auVar184._12_4_ =
               (float)bezier_basis0._488_4_ * fVar57 +
               fVar81 * (float)bezier_basis0._1644_4_ +
               fVar114 * (float)bezier_basis0._2800_4_ + fVar100 * (float)bezier_basis0._3956_4_;
          auVar184._16_4_ =
               (float)bezier_basis0._492_4_ * fVar61 +
               fVar58 * (float)bezier_basis0._1648_4_ +
               fVar82 * (float)bezier_basis0._2804_4_ + fVar115 * (float)bezier_basis0._3960_4_;
          auVar184._20_4_ =
               (float)bezier_basis0._496_4_ * fVar161 +
               fVar59 * (float)bezier_basis0._1652_4_ +
               fVar104 * (float)bezier_basis0._2808_4_ + fVar130 * (float)bezier_basis0._3964_4_;
          auVar184._24_4_ =
               (float)bezier_basis0._500_4_ * fVar33 +
               fVar60 * (float)bezier_basis0._1656_4_ +
               fVar107 * (float)bezier_basis0._2812_4_ + fVar83 * (float)bezier_basis0._3968_4_;
          auVar184._28_4_ = auVar14._28_4_ + 0.0 + 0.0 + 0.0;
          auVar77._0_4_ =
               (float)bezier_basis0._5100_4_ * fVar61 +
               (float)bezier_basis0._6256_4_ * fVar58 +
               fVar115 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar82;
          auVar77._4_4_ =
               (float)bezier_basis0._5104_4_ * fVar161 +
               (float)bezier_basis0._6260_4_ * fVar59 +
               fVar130 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar104;
          auVar77._8_4_ =
               (float)bezier_basis0._5108_4_ * fVar33 +
               (float)bezier_basis0._6264_4_ * fVar60 +
               fVar83 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar107;
          auVar77._12_4_ =
               (float)bezier_basis0._5112_4_ * fVar57 +
               (float)bezier_basis0._6268_4_ * fVar81 +
               fVar100 * (float)bezier_basis0._8580_4_ + (float)bezier_basis0._7424_4_ * fVar114;
          auVar77._16_4_ =
               (float)bezier_basis0._5116_4_ * fVar61 +
               (float)bezier_basis0._6272_4_ * fVar58 +
               fVar115 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar82;
          auVar77._20_4_ =
               (float)bezier_basis0._5120_4_ * fVar161 +
               (float)bezier_basis0._6276_4_ * fVar59 +
               fVar130 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar104;
          auVar77._24_4_ =
               (float)bezier_basis0._5124_4_ * fVar33 +
               (float)bezier_basis0._6280_4_ * fVar60 +
               fVar83 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar107;
          auVar77._28_4_ = fVar57 + fVar81 + fVar100 + fVar114;
          auVar54 = vblendps_avx(auVar77,ZEXT432(0) << 0x20,1);
          auVar15._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar15._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar15._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar15._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar15._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar15._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar15._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar15._28_4_ = auVar54._28_4_;
          auVar96 = vsubps_avx(auVar184,auVar15);
          auVar54 = vblendps_avx(auVar77,ZEXT432(0) << 0x20,0x80);
          auVar78._0_4_ = auVar184._0_4_ + auVar54._0_4_ * 0.055555556;
          auVar78._4_4_ = auVar184._4_4_ + auVar54._4_4_ * 0.055555556;
          auVar78._8_4_ = auVar184._8_4_ + auVar54._8_4_ * 0.055555556;
          auVar78._12_4_ = auVar184._12_4_ + auVar54._12_4_ * 0.055555556;
          auVar78._16_4_ = auVar184._16_4_ + auVar54._16_4_ * 0.055555556;
          auVar78._20_4_ = auVar184._20_4_ + auVar54._20_4_ * 0.055555556;
          auVar78._24_4_ = auVar184._24_4_ + auVar54._24_4_ * 0.055555556;
          auVar78._28_4_ = auVar184._28_4_ + auVar54._28_4_;
          auVar54 = vmaxps_avx(auVar159,auVar184);
          auVar14 = vmaxps_avx(auVar96,auVar78);
          auVar14 = vmaxps_avx(auVar54,auVar14);
          auVar54 = vminps_avx(auVar16,auVar95);
          auVar146._8_4_ = 0x7f800000;
          auVar146._0_8_ = 0x7f8000007f800000;
          auVar146._12_4_ = 0x7f800000;
          auVar146._16_4_ = 0x7f800000;
          auVar146._20_4_ = 0x7f800000;
          auVar146._24_4_ = 0x7f800000;
          auVar146._28_4_ = 0x7f800000;
          auVar16 = vminps_avx(auVar146,auVar110);
          auVar15 = vminps_avx(auVar16,auVar54);
          auVar54 = vminps_avx(auVar17,auVar97);
          auVar17 = vminps_avx(auVar146,auVar55);
          auVar17 = vminps_avx(auVar17,auVar54);
          auVar54 = vminps_avx(auVar96,auVar78);
          auVar96 = vminps_avx(auVar146,auVar184);
          auVar96 = vminps_avx(auVar96,auVar54);
          auVar43 = vsubps_avx(auVar44,_local_1a8);
          auVar46 = vsubps_avx(auVar66,_local_318);
          auVar67 = vsubps_avx(auVar154,_local_128);
          auVar38 = vsubps_avx(auVar136,_local_358);
          auVar66._0_4_ = auVar38._0_4_ * 0.33333334;
          auVar66._4_4_ = auVar38._4_4_ * 0.33333334;
          auVar66._8_4_ = auVar38._8_4_ * 0.33333334;
          auVar66._12_4_ = auVar38._12_4_ * 0.33333334;
          auVar72 = vsubps_avx(auVar67,auVar66);
          auVar38 = vshufps_avx(auVar72,auVar72,0);
          auVar42 = vshufps_avx(auVar67,auVar67,0);
          fVar61 = auVar38._0_4_;
          fVar57 = auVar38._4_4_;
          fVar60 = auVar38._8_4_;
          fVar104 = auVar38._12_4_;
          fVar161 = auVar42._0_4_;
          fVar58 = auVar42._4_4_;
          fVar81 = auVar42._8_4_;
          fVar107 = auVar42._12_4_;
          auVar47._0_4_ = auVar43._0_4_ + auVar46._0_4_ * 0.33333334;
          auVar47._4_4_ = auVar43._4_4_ + auVar46._4_4_ * 0.33333334;
          auVar47._8_4_ = auVar43._8_4_ + auVar46._8_4_ * 0.33333334;
          auVar47._12_4_ = auVar43._12_4_ + auVar46._12_4_ * 0.33333334;
          auVar38 = vshufps_avx(auVar47,auVar47,0);
          fVar114 = auVar38._0_4_;
          fVar115 = auVar38._4_4_;
          fVar130 = auVar38._8_4_;
          auVar42 = vshufps_avx(auVar43,auVar43,0);
          fVar33 = auVar42._0_4_;
          fVar59 = auVar42._4_4_;
          fVar82 = auVar42._8_4_;
          auVar191._0_4_ =
               (float)bezier_basis0._476_4_ * fVar33 +
               fVar114 * (float)bezier_basis0._1632_4_ +
               (float)bezier_basis0._2788_4_ * fVar61 + (float)bezier_basis0._3944_4_ * fVar161;
          auVar191._4_4_ =
               (float)bezier_basis0._480_4_ * fVar59 +
               fVar115 * (float)bezier_basis0._1636_4_ +
               (float)bezier_basis0._2792_4_ * fVar57 + (float)bezier_basis0._3948_4_ * fVar58;
          auVar191._8_4_ =
               (float)bezier_basis0._484_4_ * fVar82 +
               fVar130 * (float)bezier_basis0._1640_4_ +
               (float)bezier_basis0._2796_4_ * fVar60 + (float)bezier_basis0._3952_4_ * fVar81;
          auVar191._12_4_ =
               (float)bezier_basis0._488_4_ * auVar42._12_4_ +
               auVar38._12_4_ * (float)bezier_basis0._1644_4_ +
               (float)bezier_basis0._2800_4_ * fVar104 + (float)bezier_basis0._3956_4_ * fVar107;
          auVar191._16_4_ =
               (float)bezier_basis0._492_4_ * fVar33 +
               fVar114 * (float)bezier_basis0._1648_4_ +
               (float)bezier_basis0._2804_4_ * fVar61 + (float)bezier_basis0._3960_4_ * fVar161;
          auVar191._20_4_ =
               (float)bezier_basis0._496_4_ * fVar59 +
               fVar115 * (float)bezier_basis0._1652_4_ +
               (float)bezier_basis0._2808_4_ * fVar57 + (float)bezier_basis0._3964_4_ * fVar58;
          auVar191._24_4_ =
               (float)bezier_basis0._500_4_ * fVar82 +
               fVar130 * (float)bezier_basis0._1656_4_ +
               (float)bezier_basis0._2812_4_ * fVar60 + (float)bezier_basis0._3968_4_ * fVar81;
          auVar191._28_4_ = auVar16._28_4_ + auVar15._28_4_ + 0.0 + 0.0;
          auVar111._0_4_ =
               (float)bezier_basis0._5100_4_ * fVar33 +
               fVar114 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar61 + (float)bezier_basis0._8568_4_ * fVar161;
          auVar111._4_4_ =
               (float)bezier_basis0._5104_4_ * fVar59 +
               fVar115 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar57 + (float)bezier_basis0._8572_4_ * fVar58;
          auVar111._8_4_ =
               (float)bezier_basis0._5108_4_ * fVar82 +
               fVar130 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar60 + (float)bezier_basis0._8576_4_ * fVar81;
          auVar111._12_4_ =
               (float)bezier_basis0._5112_4_ * auVar42._12_4_ +
               auVar38._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar104 + (float)bezier_basis0._8580_4_ * fVar107;
          auVar111._16_4_ =
               (float)bezier_basis0._5116_4_ * fVar33 +
               fVar114 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar61 + (float)bezier_basis0._8584_4_ * fVar161;
          auVar111._20_4_ =
               (float)bezier_basis0._5120_4_ * fVar59 +
               fVar115 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar57 + (float)bezier_basis0._8588_4_ * fVar58;
          auVar111._24_4_ =
               (float)bezier_basis0._5124_4_ * fVar82 +
               fVar130 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar60 + (float)bezier_basis0._8592_4_ * fVar81;
          auVar111._28_4_ = fVar107 + fVar107 + fVar104 + fVar107;
          auVar54 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,1);
          auVar16._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar16._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar16._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar16._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar16._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar16._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar16._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar16._28_4_ = auVar54._28_4_;
          auVar55 = vsubps_avx(auVar191,auVar16);
          auVar54 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
          auVar122._0_4_ = auVar191._0_4_ + auVar54._0_4_ * 0.055555556;
          auVar122._4_4_ = auVar191._4_4_ + auVar54._4_4_ * 0.055555556;
          auVar122._8_4_ = auVar191._8_4_ + auVar54._8_4_ * 0.055555556;
          auVar122._12_4_ = auVar191._12_4_ + auVar54._12_4_ * 0.055555556;
          auVar122._16_4_ = auVar191._16_4_ + auVar54._16_4_ * 0.055555556;
          auVar122._20_4_ = auVar191._20_4_ + auVar54._20_4_ * 0.055555556;
          auVar122._24_4_ = auVar191._24_4_ + auVar54._24_4_ * 0.055555556;
          auVar122._28_4_ = auVar191._28_4_ + auVar54._28_4_;
          auVar98._8_4_ = 0xff800000;
          auVar98._0_8_ = 0xff800000ff800000;
          auVar98._12_4_ = 0xff800000;
          auVar98._16_4_ = 0xff800000;
          auVar98._20_4_ = 0xff800000;
          auVar98._24_4_ = 0xff800000;
          auVar98._28_4_ = 0xff800000;
          auVar54 = vmaxps_avx(auVar98,auVar191);
          auVar16 = vmaxps_avx(auVar55,auVar122);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar38 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar42 = vshufps_avx(auVar72,auVar72,0x55);
          auVar46 = vshufps_avx(auVar67,auVar67,0x55);
          fVar61 = auVar42._0_4_;
          fVar33 = auVar42._4_4_;
          fVar58 = auVar42._8_4_;
          fVar60 = auVar42._12_4_;
          fVar161 = auVar46._0_4_;
          fVar57 = auVar46._4_4_;
          fVar59 = auVar46._8_4_;
          fVar81 = auVar46._12_4_;
          auVar42 = vshufps_avx(auVar47,auVar47,0x55);
          fVar82 = auVar42._0_4_;
          fVar104 = auVar42._4_4_;
          fVar107 = auVar42._8_4_;
          auVar46 = vshufps_avx(auVar43,auVar43,0x55);
          fVar114 = auVar46._0_4_;
          fVar115 = auVar46._4_4_;
          fVar130 = auVar46._8_4_;
          auVar123._0_4_ =
               fVar114 * (float)bezier_basis0._476_4_ +
               fVar82 * (float)bezier_basis0._1632_4_ +
               (float)bezier_basis0._2788_4_ * fVar61 + (float)bezier_basis0._3944_4_ * fVar161;
          auVar123._4_4_ =
               fVar115 * (float)bezier_basis0._480_4_ +
               fVar104 * (float)bezier_basis0._1636_4_ +
               (float)bezier_basis0._2792_4_ * fVar33 + (float)bezier_basis0._3948_4_ * fVar57;
          auVar123._8_4_ =
               fVar130 * (float)bezier_basis0._484_4_ +
               fVar107 * (float)bezier_basis0._1640_4_ +
               (float)bezier_basis0._2796_4_ * fVar58 + (float)bezier_basis0._3952_4_ * fVar59;
          auVar123._12_4_ =
               auVar46._12_4_ * (float)bezier_basis0._488_4_ +
               auVar42._12_4_ * (float)bezier_basis0._1644_4_ +
               (float)bezier_basis0._2800_4_ * fVar60 + (float)bezier_basis0._3956_4_ * fVar81;
          auVar123._16_4_ =
               fVar114 * (float)bezier_basis0._492_4_ +
               fVar82 * (float)bezier_basis0._1648_4_ +
               (float)bezier_basis0._2804_4_ * fVar61 + (float)bezier_basis0._3960_4_ * fVar161;
          auVar123._20_4_ =
               fVar115 * (float)bezier_basis0._496_4_ +
               fVar104 * (float)bezier_basis0._1652_4_ +
               (float)bezier_basis0._2808_4_ * fVar33 + (float)bezier_basis0._3964_4_ * fVar57;
          auVar123._24_4_ =
               fVar130 * (float)bezier_basis0._500_4_ +
               fVar107 * (float)bezier_basis0._1656_4_ +
               (float)bezier_basis0._2812_4_ * fVar58 + (float)bezier_basis0._3968_4_ * fVar59;
          auVar123._28_4_ =
               (float)bezier_basis0._3972_4_ + (float)bezier_basis0._2816_4_ + auVar55._28_4_ + 0.0;
          auVar112._0_4_ =
               fVar114 * (float)bezier_basis0._5100_4_ +
               fVar82 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar61 + (float)bezier_basis0._8568_4_ * fVar161;
          auVar112._4_4_ =
               fVar115 * (float)bezier_basis0._5104_4_ +
               fVar104 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar33 + (float)bezier_basis0._8572_4_ * fVar57;
          auVar112._8_4_ =
               fVar130 * (float)bezier_basis0._5108_4_ +
               fVar107 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar58 + (float)bezier_basis0._8576_4_ * fVar59;
          auVar112._12_4_ =
               auVar46._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar42._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar60 + (float)bezier_basis0._8580_4_ * fVar81;
          auVar112._16_4_ =
               fVar114 * (float)bezier_basis0._5116_4_ +
               fVar82 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar61 + (float)bezier_basis0._8584_4_ * fVar161;
          auVar112._20_4_ =
               fVar115 * (float)bezier_basis0._5120_4_ +
               fVar104 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar33 + (float)bezier_basis0._8588_4_ * fVar57;
          auVar112._24_4_ =
               fVar130 * (float)bezier_basis0._5124_4_ +
               fVar107 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar58 + (float)bezier_basis0._8592_4_ * fVar59;
          auVar112._28_4_ = fVar81 + fVar81 + fVar60 + fVar81;
          auVar54 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,1);
          auVar18._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar18._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar18._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar18._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar18._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar18._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar18._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar18._28_4_ = auVar54._28_4_;
          auVar18 = vsubps_avx(auVar123,auVar18);
          auVar54 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
          auVar113._0_4_ = auVar123._0_4_ + auVar54._0_4_ * 0.055555556;
          auVar113._4_4_ = auVar123._4_4_ + auVar54._4_4_ * 0.055555556;
          auVar113._8_4_ = auVar123._8_4_ + auVar54._8_4_ * 0.055555556;
          auVar113._12_4_ = auVar123._12_4_ + auVar54._12_4_ * 0.055555556;
          auVar113._16_4_ = auVar123._16_4_ + auVar54._16_4_ * 0.055555556;
          auVar113._20_4_ = auVar123._20_4_ + auVar54._20_4_ * 0.055555556;
          auVar113._24_4_ = auVar123._24_4_ + auVar54._24_4_ * 0.055555556;
          auVar113._28_4_ = auVar123._28_4_ + auVar54._28_4_;
          auVar79._8_4_ = 0xff800000;
          auVar79._0_8_ = 0xff800000ff800000;
          auVar79._12_4_ = 0xff800000;
          auVar79._16_4_ = 0xff800000;
          auVar79._20_4_ = 0xff800000;
          auVar79._24_4_ = 0xff800000;
          auVar79._28_4_ = 0xff800000;
          auVar54 = vmaxps_avx(auVar79,auVar123);
          auVar16 = vmaxps_avx(auVar18,auVar113);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar42 = vunpcklps_avx(auVar38,auVar42);
          auVar38 = vshufps_avx(auVar72,auVar72,0xaa);
          fVar58 = auVar38._0_4_;
          fVar59 = auVar38._4_4_;
          fVar60 = auVar38._8_4_;
          fVar81 = auVar38._12_4_;
          auVar38 = vshufps_avx(auVar67,auVar67,0xaa);
          fVar115 = auVar38._0_4_;
          fVar130 = auVar38._4_4_;
          fVar83 = auVar38._8_4_;
          fVar100 = auVar38._12_4_;
          auVar38 = vshufps_avx(auVar47,auVar47,0xaa);
          fVar61 = auVar38._0_4_;
          fVar161 = auVar38._4_4_;
          fVar33 = auVar38._8_4_;
          fVar57 = auVar38._12_4_;
          auVar38 = vshufps_avx(auVar43,auVar43,0xaa);
          fVar82 = auVar38._0_4_;
          fVar104 = auVar38._4_4_;
          fVar107 = auVar38._8_4_;
          fVar114 = auVar38._12_4_;
          auVar99._0_4_ =
               fVar82 * (float)bezier_basis0._476_4_ +
               fVar61 * (float)bezier_basis0._1632_4_ +
               fVar58 * (float)bezier_basis0._2788_4_ + fVar115 * (float)bezier_basis0._3944_4_;
          auVar99._4_4_ =
               fVar104 * (float)bezier_basis0._480_4_ +
               fVar161 * (float)bezier_basis0._1636_4_ +
               fVar59 * (float)bezier_basis0._2792_4_ + fVar130 * (float)bezier_basis0._3948_4_;
          auVar99._8_4_ =
               fVar107 * (float)bezier_basis0._484_4_ +
               fVar33 * (float)bezier_basis0._1640_4_ +
               fVar60 * (float)bezier_basis0._2796_4_ + fVar83 * (float)bezier_basis0._3952_4_;
          auVar99._12_4_ =
               fVar114 * (float)bezier_basis0._488_4_ +
               fVar57 * (float)bezier_basis0._1644_4_ +
               fVar81 * (float)bezier_basis0._2800_4_ + fVar100 * (float)bezier_basis0._3956_4_;
          auVar99._16_4_ =
               fVar82 * (float)bezier_basis0._492_4_ +
               fVar61 * (float)bezier_basis0._1648_4_ +
               fVar58 * (float)bezier_basis0._2804_4_ + fVar115 * (float)bezier_basis0._3960_4_;
          auVar99._20_4_ =
               fVar104 * (float)bezier_basis0._496_4_ +
               fVar161 * (float)bezier_basis0._1652_4_ +
               fVar59 * (float)bezier_basis0._2808_4_ + fVar130 * (float)bezier_basis0._3964_4_;
          auVar99._24_4_ =
               fVar107 * (float)bezier_basis0._500_4_ +
               fVar33 * (float)bezier_basis0._1656_4_ +
               fVar60 * (float)bezier_basis0._2812_4_ + fVar83 * (float)bezier_basis0._3968_4_;
          auVar99._28_4_ = 0;
          auVar80._0_4_ =
               fVar82 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar61 +
               fVar115 * (float)bezier_basis0._8568_4_ + fVar58 * (float)bezier_basis0._7412_4_;
          auVar80._4_4_ =
               fVar104 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar161 +
               fVar130 * (float)bezier_basis0._8572_4_ + fVar59 * (float)bezier_basis0._7416_4_;
          auVar80._8_4_ =
               fVar107 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar33 +
               fVar83 * (float)bezier_basis0._8576_4_ + fVar60 * (float)bezier_basis0._7420_4_;
          auVar80._12_4_ =
               fVar114 * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * fVar57 +
               fVar100 * (float)bezier_basis0._8580_4_ + fVar81 * (float)bezier_basis0._7424_4_;
          auVar80._16_4_ =
               fVar82 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar61 +
               fVar115 * (float)bezier_basis0._8584_4_ + fVar58 * (float)bezier_basis0._7428_4_;
          auVar80._20_4_ =
               fVar104 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar161 +
               fVar130 * (float)bezier_basis0._8588_4_ + fVar59 * (float)bezier_basis0._7432_4_;
          auVar80._24_4_ =
               fVar107 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar33 +
               fVar83 * (float)bezier_basis0._8592_4_ + fVar60 * (float)bezier_basis0._7436_4_;
          auVar80._28_4_ = fVar114 + fVar57 + fVar100 + fVar81;
          auVar54 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,1);
          auVar19._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar19._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar19._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar19._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar19._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar19._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar19._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar19._28_4_ = auVar54._28_4_;
          auVar19 = vsubps_avx(auVar99,auVar19);
          auVar54 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,0x80);
          auVar167._0_4_ = auVar99._0_4_ + auVar54._0_4_ * 0.055555556;
          auVar167._4_4_ = auVar99._4_4_ + auVar54._4_4_ * 0.055555556;
          auVar167._8_4_ = auVar99._8_4_ + auVar54._8_4_ * 0.055555556;
          auVar167._12_4_ = auVar99._12_4_ + auVar54._12_4_ * 0.055555556;
          auVar167._16_4_ = auVar99._16_4_ + auVar54._16_4_ * 0.055555556;
          auVar167._20_4_ = auVar99._20_4_ + auVar54._20_4_ * 0.055555556;
          auVar167._24_4_ = auVar99._24_4_ + auVar54._24_4_ * 0.055555556;
          auVar167._28_4_ = auVar54._28_4_ + 0.0;
          auVar56._8_4_ = 0xff800000;
          auVar56._0_8_ = 0xff800000ff800000;
          auVar56._12_4_ = 0xff800000;
          auVar56._16_4_ = 0xff800000;
          auVar56._20_4_ = 0xff800000;
          auVar56._24_4_ = 0xff800000;
          auVar56._28_4_ = 0xff800000;
          auVar54 = vmaxps_avx(auVar56,auVar99);
          auVar16 = vmaxps_avx(auVar19,auVar167);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar16);
          auVar38 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar38 = vinsertps_avx(auVar42,auVar38,0x28);
          auVar54 = vminps_avx(auVar55,auVar122);
          auVar170._8_4_ = 0x7f800000;
          auVar170._0_8_ = 0x7f8000007f800000;
          auVar170._12_4_ = 0x7f800000;
          auVar170._16_4_ = 0x7f800000;
          auVar170._20_4_ = 0x7f800000;
          auVar170._24_4_ = 0x7f800000;
          auVar170._28_4_ = 0x7f800000;
          auVar16 = vminps_avx(auVar170,auVar191);
          auVar54 = vminps_avx(auVar16,auVar54);
          auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar42 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar54 = vminps_avx(auVar18,auVar113);
          auVar16 = vminps_avx(auVar170,auVar123);
          auVar54 = vminps_avx(auVar16,auVar54);
          auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar46 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar46 = vunpcklps_avx(auVar42,auVar46);
          auVar54 = vminps_avx(auVar19,auVar167);
          auVar168 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar160 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar16 = vminps_avx(auVar170,auVar99);
          auVar54 = vminps_avx(auVar16,auVar54);
          auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar42 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar42 = vinsertps_avx(auVar46,auVar42,0x28);
          auVar54 = vshufps_avx(auVar96,auVar96,0xb1);
          auVar54 = vminps_avx(auVar96,auVar54);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar46 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar54 = vshufps_avx(auVar17,auVar17,0xb1);
          auVar54 = vminps_avx(auVar17,auVar54);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar43 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar43 = vunpcklps_avx(auVar46,auVar43);
          auVar54 = vshufps_avx(auVar15,auVar15,0xb1);
          auVar54 = vminps_avx(auVar15,auVar54);
          auVar16 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vminps_avx(auVar54,auVar16);
          auVar46 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar46 = vinsertps_avx(auVar43,auVar46,0x28);
          auVar43 = vminps_avx(auVar42,auVar46);
          auVar54 = vshufps_avx(auVar14,auVar14,0xb1);
          auVar54 = vmaxps_avx(auVar14,auVar54);
          auVar14 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar14);
          auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar54 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar54 = vmaxps_avx(auVar53,auVar54);
          auVar14 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar14);
          auVar46 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar46 = vunpcklps_avx(auVar42,auVar46);
          auVar54 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar54 = vmaxps_avx(auVar13,auVar54);
          auVar13 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar13);
          auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar42 = vinsertps_avx(auVar46,auVar42,0x28);
          auVar46 = vmaxps_avx(auVar38,auVar42);
          auVar109._8_4_ = 0x7fffffff;
          auVar109._0_8_ = 0x7fffffff7fffffff;
          auVar109._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx(auVar43,auVar109);
          auVar42 = vandps_avx(auVar46,auVar109);
          auVar38 = vmaxps_avx(auVar38,auVar42);
          auVar42 = vmovshdup_avx(auVar38);
          auVar42 = vmaxss_avx(auVar42,auVar38);
          auVar38 = vshufpd_avx(auVar38,auVar38,1);
          auVar38 = vmaxss_avx(auVar38,auVar42);
          auVar38 = ZEXT416((uint)(auVar38._0_4_ * 4.7683716e-07));
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          auVar42 = vsubps_avx(auVar43,auVar38);
          aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar42,ZEXT416(geomID),0x30);
          auVar73._0_4_ = auVar46._0_4_ + auVar38._0_4_;
          auVar73._4_4_ = auVar46._4_4_ + auVar38._4_4_;
          auVar73._8_4_ = auVar46._8_4_ + auVar38._8_4_;
          auVar73._12_4_ = auVar46._12_4_ + auVar38._12_4_;
          aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar73,ZEXT416((uint)uVar29),0x30);
          auVar91._0_4_ = aVar11.x + aVar12.x;
          auVar91._4_4_ = aVar11.y + aVar12.y;
          auVar91._8_4_ = aVar11.z + aVar12.z;
          auVar91._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
          local_168 = vminps_avx(local_168,auVar91);
          local_158 = vmaxps_avx(local_158,auVar91);
          local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar12);
          prims[local_2d0].upper.field_0.field_1 = aVar12;
          local_188 = vminps_avx(local_188,(undefined1  [16])aVar11);
          prims[local_2d0].lower.field_0.field_1 = aVar11;
          local_2d8 = local_2d8 + 1;
          local_2d0 = local_2d0 + 1;
          break;
        }
        lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar28);
        lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar27)),
                                ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar31)),0x10);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar32)),0x20);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar7 + 0xc + lVar8 * uVar30)),0x30);
        auVar62._8_4_ = 0x7fffffff;
        auVar62._0_8_ = 0x7fffffff7fffffff;
        auVar62._12_4_ = 0x7fffffff;
        auVar38 = vandps_avx(auVar38,auVar62);
        auVar42 = auVar160._0_16_;
        auVar38 = vcmpps_avx(auVar38,auVar42,5);
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar38[0xf] < '\0') break;
        auVar38 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar27);
        auVar67 = auVar168._0_16_;
        auVar46 = vcmpps_avx(auVar38,auVar67,6);
        auVar43 = vcmpps_avx(auVar38,auVar42,1);
        auVar46 = vandps_avx(auVar46,auVar43);
        uVar26 = vmovmskps_avx(auVar46);
        if ((~(byte)uVar26 & 7) != 0) break;
        auVar46 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar31);
        auVar43 = vcmpps_avx(auVar46,auVar67,6);
        auVar72 = vcmpps_avx(auVar46,auVar42,1);
        auVar43 = vandps_avx(auVar43,auVar72);
        uVar26 = vmovmskps_avx(auVar43);
        if ((~(byte)uVar26 & 7) != 0) break;
        auVar43 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar32);
        auVar72 = vcmpps_avx(auVar43,auVar67,6);
        auVar47 = vcmpps_avx(auVar43,auVar42,1);
        auVar72 = vandps_avx(auVar72,auVar47);
        uVar26 = vmovmskps_avx(auVar72);
        if ((~(byte)uVar26 & 7) != 0) break;
        auVar72 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar30);
        auVar47 = vcmpps_avx(auVar72,auVar67,6);
        auVar66 = vcmpps_avx(auVar72,auVar42,1);
        auVar47 = vandps_avx(auVar47,auVar66);
        uVar26 = vmovmskps_avx(auVar47);
        if ((~(byte)uVar26 & 7) != 0) break;
        lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar28);
        lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar28);
        auVar47 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar27);
        auVar66 = vcmpps_avx(auVar47,auVar67,6);
        auVar44 = vcmpps_avx(auVar47,auVar42,1);
        auVar66 = vandps_avx(auVar66,auVar44);
        uVar26 = vmovmskps_avx(auVar66);
        if ((~(byte)uVar26 & 7) != 0) break;
        auVar66 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar31);
        auVar67 = vcmpps_avx(auVar66,auVar67,6);
        auVar42 = vcmpps_avx(auVar66,auVar42,1);
        auVar42 = vandps_avx(auVar67,auVar42);
        uVar26 = vmovmskps_avx(auVar42);
        if ((~(byte)uVar26 & 7) != 0) break;
        auVar42 = vshufps_avx(auVar38,auVar38,0xff);
        auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(auVar42._0_4_ * fVar61)),0x30);
        auVar42 = vshufps_avx(auVar46,auVar46,0xff);
        auVar42 = vinsertps_avx(auVar46,ZEXT416((uint)(auVar42._0_4_ * fVar61)),0x30);
        auVar46 = vshufps_avx(auVar43,auVar43,0xff);
        auVar46 = vinsertps_avx(auVar43,ZEXT416((uint)(auVar46._0_4_ * fVar61)),0x30);
        auVar43 = vshufps_avx(auVar72,auVar72,0xff);
        auVar43 = vinsertps_avx(auVar72,ZEXT416((uint)(auVar43._0_4_ * fVar61)),0x30);
        fVar125 = auVar47._0_4_;
        fVar116 = auVar47._4_4_;
        fVar124 = auVar47._8_4_;
        fVar126 = auVar47._12_4_;
        pauVar1 = (undefined1 (*) [12])(lVar7 + lVar8 * uVar32);
        auVar25 = *pauVar1;
        fVar161 = *(float *)pauVar1[1];
        fVar60 = *(float *)*pauVar1 * 0.0;
        fVar81 = *(float *)(*pauVar1 + 4) * 0.0;
        fVar82 = *(float *)(*pauVar1 + 8) * 0.0;
        pauVar2 = (undefined1 (*) [16])(lVar7 + lVar8 * uVar30);
        auVar47 = *pauVar2;
        fVar178 = *(float *)*pauVar2 * -0.0;
        fVar185 = *(float *)(*pauVar2 + 4) * -0.0;
        fVar186 = *(float *)(*pauVar2 + 8) * -0.0;
        fVar187 = *(float *)(*pauVar2 + 0xc) * -0.0;
        fVar130 = auVar66._0_4_;
        fVar83 = auVar66._4_4_;
        fVar100 = auVar66._8_4_;
        fVar102 = auVar66._12_4_;
        auVar34._0_4_ = fVar125 * -0.0 + fVar130 + fVar178 + fVar60;
        auVar34._4_4_ = fVar116 * -0.0 + fVar83 + fVar185 + fVar81;
        auVar34._8_4_ = fVar124 * -0.0 + fVar100 + fVar186 + fVar82;
        auVar34._12_4_ = fVar126 * -0.0 + fVar102 + fVar187 + fVar161 * 0.0;
        fVar105 = auVar42._0_4_;
        fVar147 = auVar42._4_4_;
        fVar148 = auVar42._8_4_;
        fVar117 = auVar42._12_4_;
        fVar84 = auVar46._0_4_;
        fVar101 = auVar46._4_4_;
        fVar103 = auVar46._8_4_;
        fVar106 = auVar46._12_4_;
        fVar104 = auVar43._0_4_;
        fVar107 = auVar43._4_4_;
        fVar114 = auVar43._8_4_;
        fVar115 = auVar43._12_4_;
        auVar63._0_4_ = fVar105 * 0.0 + fVar84 * 0.5 + fVar104 * 0.0;
        auVar63._4_4_ = fVar147 * 0.0 + fVar101 * 0.5 + fVar107 * 0.0;
        auVar63._8_4_ = fVar148 * 0.0 + fVar103 * 0.5 + fVar114 * 0.0;
        auVar63._12_4_ = fVar117 * 0.0 + fVar106 * 0.5 + fVar115 * 0.0;
        fVar127 = auVar38._0_4_;
        auVar85._0_4_ = fVar127 * 0.5;
        fVar128 = auVar38._4_4_;
        auVar85._4_4_ = fVar128 * 0.5;
        fVar129 = auVar38._8_4_;
        auVar85._8_4_ = fVar129 * 0.5;
        fVar143 = auVar38._12_4_;
        auVar85._12_4_ = fVar143 * 0.5;
        auVar72 = vsubps_avx(auVar63,auVar85);
        auVar46 = vshufps_avx(auVar72,auVar72,0xc9);
        auVar64._0_4_ = auVar46._0_4_ * auVar34._0_4_;
        auVar64._4_4_ = auVar46._4_4_ * auVar34._4_4_;
        auVar64._8_4_ = auVar46._8_4_ * auVar34._8_4_;
        auVar64._12_4_ = auVar46._12_4_ * auVar34._12_4_;
        auVar38 = vshufps_avx(auVar34,auVar34,0xc9);
        fVar149 = auVar72._0_4_;
        auVar35._0_4_ = fVar149 * auVar38._0_4_;
        fVar150 = auVar72._4_4_;
        auVar35._4_4_ = fVar150 * auVar38._4_4_;
        fVar151 = auVar72._8_4_;
        auVar35._8_4_ = fVar151 * auVar38._8_4_;
        fVar197 = auVar72._12_4_;
        auVar35._12_4_ = fVar197 * auVar38._12_4_;
        auVar38 = vsubps_avx(auVar64,auVar35);
        auVar43 = vshufps_avx(auVar38,auVar38,0xc9);
        auVar38 = vdpps_avx(auVar43,auVar43,0x7f);
        fVar57 = auVar38._0_4_;
        auVar66 = ZEXT416((uint)fVar57);
        auVar42 = vrsqrtss_avx(auVar66,auVar66);
        fVar33 = auVar42._0_4_;
        auVar171._0_4_ = fVar130 * 0.0 + *(float *)*pauVar2 * 0.0 + *(float *)*pauVar1 * 0.5;
        auVar171._4_4_ =
             fVar83 * 0.0 + *(float *)(*pauVar2 + 4) * 0.0 + *(float *)(*pauVar1 + 4) * 0.5;
        auVar171._8_4_ =
             fVar100 * 0.0 + *(float *)(*pauVar2 + 8) * 0.0 + *(float *)(*pauVar1 + 8) * 0.5;
        auVar171._12_4_ = fVar102 * 0.0 + *(float *)(*pauVar2 + 0xc) * 0.0 + fVar161 * 0.5;
        auVar162._0_4_ = fVar125 * 0.5;
        auVar162._4_4_ = fVar116 * 0.5;
        auVar162._8_4_ = fVar124 * 0.5;
        auVar162._12_4_ = fVar126 * 0.5;
        auVar42 = vsubps_avx(auVar171,auVar162);
        auVar172._0_4_ = auVar42._0_4_ * auVar46._0_4_;
        auVar172._4_4_ = auVar42._4_4_ * auVar46._4_4_;
        auVar172._8_4_ = auVar42._8_4_ * auVar46._8_4_;
        auVar172._12_4_ = auVar42._12_4_ * auVar46._12_4_;
        auVar42 = vshufps_avx(auVar42,auVar42,0xc9);
        auVar163._0_4_ = fVar149 * auVar42._0_4_;
        auVar163._4_4_ = fVar150 * auVar42._4_4_;
        auVar163._8_4_ = fVar151 * auVar42._8_4_;
        auVar163._12_4_ = fVar197 * auVar42._12_4_;
        auVar42 = vsubps_avx(auVar172,auVar163);
        auVar46 = vshufps_avx(auVar42,auVar42,0xc9);
        auVar42 = vdpps_avx(auVar43,auVar46,0x7f);
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        auVar164._0_4_ = auVar38._0_4_ * auVar46._0_4_;
        auVar164._4_4_ = auVar38._4_4_ * auVar46._4_4_;
        auVar164._8_4_ = auVar38._8_4_ * auVar46._8_4_;
        auVar164._12_4_ = auVar38._12_4_ * auVar46._12_4_;
        auVar38 = vshufps_avx(auVar42,auVar42,0);
        auVar173._0_4_ = auVar38._0_4_ * auVar43._0_4_;
        auVar173._4_4_ = auVar38._4_4_ * auVar43._4_4_;
        auVar173._8_4_ = auVar38._8_4_ * auVar43._8_4_;
        auVar173._12_4_ = auVar38._12_4_ * auVar43._12_4_;
        auVar67 = vsubps_avx(auVar164,auVar173);
        auVar38 = vrcpss_avx(auVar66,auVar66);
        auVar38 = ZEXT416((uint)((2.0 - fVar57 * auVar38._0_4_) * auVar38._0_4_));
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        auVar42 = ZEXT416((uint)(fVar33 * 1.5 - fVar33 * fVar33 * fVar57 * 0.5 * fVar33));
        auVar42 = vshufps_avx(auVar42,auVar42,0);
        fVar33 = auVar43._0_4_ * auVar42._0_4_;
        fVar57 = auVar43._4_4_ * auVar42._4_4_;
        fVar58 = auVar43._8_4_ * auVar42._8_4_;
        fVar59 = auVar43._12_4_ * auVar42._12_4_;
        auVar189._0_4_ = fVar127 * -0.0 + fVar104 * -0.0 + fVar84 * 0.0 + fVar105;
        auVar189._4_4_ = fVar128 * -0.0 + fVar107 * -0.0 + fVar101 * 0.0 + fVar147;
        auVar189._8_4_ = fVar129 * -0.0 + fVar114 * -0.0 + fVar103 * 0.0 + fVar148;
        auVar189._12_4_ = fVar143 * -0.0 + fVar115 * -0.0 + fVar106 * 0.0 + fVar117;
        auVar46 = vshufps_avx(auVar72,auVar72,0xff);
        auVar43 = vshufps_avx(auVar189,auVar189,0xff);
        local_108._0_4_ = auVar43._0_4_ * fVar33;
        local_108._4_4_ = auVar43._4_4_ * fVar57;
        fStack_100 = auVar43._8_4_ * fVar58;
        fStack_fc = auVar43._12_4_ * fVar59;
        local_148._0_4_ =
             auVar46._0_4_ * fVar33 + auVar43._0_4_ * auVar42._0_4_ * auVar67._0_4_ * auVar38._0_4_;
        local_148._4_4_ =
             auVar46._4_4_ * fVar57 + auVar43._4_4_ * auVar42._4_4_ * auVar67._4_4_ * auVar38._4_4_;
        fStack_140 = auVar46._8_4_ * fVar58 +
                     auVar43._8_4_ * auVar42._8_4_ * auVar67._8_4_ * auVar38._8_4_;
        fStack_13c = auVar46._12_4_ * fVar59 +
                     auVar43._12_4_ * auVar42._12_4_ * auVar67._12_4_ * auVar38._12_4_;
        auVar174._0_4_ = fVar127 * -0.0 + fVar104 * -0.0 + fVar84 + fVar105 * 0.0;
        auVar174._4_4_ = fVar128 * -0.0 + fVar107 * -0.0 + fVar101 + fVar147 * 0.0;
        auVar174._8_4_ = fVar129 * -0.0 + fVar114 * -0.0 + fVar103 + fVar148 * 0.0;
        auVar174._12_4_ = fVar143 * -0.0 + fVar115 * -0.0 + fVar106 + fVar117 * 0.0;
        local_338 = auVar25._0_4_;
        fStack_334 = auVar25._4_4_;
        fStack_330 = auVar25._8_4_;
        auVar36._0_4_ = fVar130 * 0.0 + local_338 + fVar178 + fVar125 * -0.0;
        auVar36._4_4_ = fVar83 * 0.0 + fStack_334 + fVar185 + fVar116 * -0.0;
        auVar36._8_4_ = fVar100 * 0.0 + fStack_330 + fVar186 + fVar124 * -0.0;
        auVar36._12_4_ = fVar102 * 0.0 + fVar161 + fVar187 + fVar126 * -0.0;
        auVar86._0_4_ = fVar84 * 0.0 + fVar104 * 0.5;
        auVar86._4_4_ = fVar101 * 0.0 + fVar107 * 0.5;
        auVar86._8_4_ = fVar103 * 0.0 + fVar114 * 0.5;
        auVar86._12_4_ = fVar106 * 0.0 + fVar115 * 0.5;
        auVar108._0_4_ = fVar105 * 0.5;
        auVar108._4_4_ = fVar147 * 0.5;
        auVar108._8_4_ = fVar148 * 0.5;
        auVar108._12_4_ = fVar117 * 0.5;
        auVar38 = vsubps_avx(auVar86,auVar108);
        auVar188._0_4_ = fVar127 * 0.0 + auVar38._0_4_;
        auVar188._4_4_ = fVar128 * 0.0 + auVar38._4_4_;
        auVar188._8_4_ = fVar129 * 0.0 + auVar38._8_4_;
        auVar188._12_4_ = fVar143 * 0.0 + auVar38._12_4_;
        auVar46 = vshufps_avx(auVar188,auVar188,0xc9);
        auVar65._0_4_ = auVar36._0_4_ * auVar46._0_4_;
        auVar65._4_4_ = auVar36._4_4_ * auVar46._4_4_;
        auVar65._8_4_ = auVar36._8_4_ * auVar46._8_4_;
        auVar65._12_4_ = auVar36._12_4_ * auVar46._12_4_;
        auVar38 = vshufps_avx(auVar36,auVar36,0xc9);
        auVar37._0_4_ = auVar188._0_4_ * auVar38._0_4_;
        auVar37._4_4_ = auVar188._4_4_ * auVar38._4_4_;
        auVar37._8_4_ = auVar188._8_4_ * auVar38._8_4_;
        auVar37._12_4_ = auVar188._12_4_ * auVar38._12_4_;
        auVar38 = vsubps_avx(auVar65,auVar37);
        auVar43 = vshufps_avx(auVar38,auVar38,0xc9);
        auVar38 = vdpps_avx(auVar43,auVar43,0x7f);
        fVar33 = auVar38._0_4_;
        auVar66 = ZEXT416((uint)fVar33);
        auVar42 = vrsqrtss_avx(auVar66,auVar66);
        fVar57 = auVar42._0_4_;
        auVar131._0_4_ = auVar189._0_4_ + (float)local_108._0_4_;
        auVar131._4_4_ = auVar189._4_4_ + (float)local_108._4_4_;
        auVar131._8_4_ = auVar189._8_4_ + fStack_100;
        auVar131._12_4_ = auVar189._12_4_ + fStack_fc;
        local_288 = auVar47._0_4_;
        fStack_284 = auVar47._4_4_;
        fStack_280 = auVar47._8_4_;
        fStack_27c = auVar47._12_4_;
        auVar152._0_4_ = local_288 * 0.5 + fVar60;
        auVar152._4_4_ = fStack_284 * 0.5 + fVar81;
        auVar152._8_4_ = fStack_280 * 0.5 + fVar82;
        auVar152._12_4_ = fStack_27c * 0.5 + fVar161 * 0.0;
        auVar190._0_4_ = (fVar149 + (float)local_148._0_4_) * 0.33333334 + auVar131._0_4_;
        auVar190._4_4_ = (fVar150 + (float)local_148._4_4_) * 0.33333334 + auVar131._4_4_;
        auVar190._8_4_ = (fVar151 + fStack_140) * 0.33333334 + auVar131._8_4_;
        auVar190._12_4_ = (fVar197 + fStack_13c) * 0.33333334 + auVar131._12_4_;
        auVar132._0_4_ = fVar130 * 0.5;
        auVar132._4_4_ = fVar83 * 0.5;
        auVar132._8_4_ = fVar100 * 0.5;
        auVar132._12_4_ = fVar102 * 0.5;
        auVar47 = vsubps_avx(auVar152,auVar132);
        auVar42 = vshufps_avx(auVar174,auVar174,0xff);
        auVar67 = ZEXT416((uint)(fVar57 * 1.5 - fVar33 * 0.5 * fVar57 * fVar57 * fVar57));
        auVar67 = vshufps_avx(auVar67,auVar67,0);
        auVar133._0_4_ = fVar125 * 0.0 + auVar47._0_4_;
        auVar133._4_4_ = fVar116 * 0.0 + auVar47._4_4_;
        auVar133._8_4_ = fVar124 * 0.0 + auVar47._8_4_;
        auVar133._12_4_ = fVar126 * 0.0 + auVar47._12_4_;
        fVar161 = auVar43._0_4_ * auVar67._0_4_;
        fVar57 = auVar43._4_4_ * auVar67._4_4_;
        fVar58 = auVar43._8_4_ * auVar67._8_4_;
        fVar59 = auVar43._12_4_ * auVar67._12_4_;
        auVar87._0_4_ = auVar133._0_4_ * auVar46._0_4_;
        auVar87._4_4_ = auVar133._4_4_ * auVar46._4_4_;
        auVar87._8_4_ = auVar133._8_4_ * auVar46._8_4_;
        auVar87._12_4_ = auVar133._12_4_ * auVar46._12_4_;
        auVar46 = vshufps_avx(auVar133,auVar133,0xc9);
        auVar134._0_4_ = auVar188._0_4_ * auVar46._0_4_;
        auVar134._4_4_ = auVar188._4_4_ * auVar46._4_4_;
        auVar134._8_4_ = auVar188._8_4_ * auVar46._8_4_;
        auVar134._12_4_ = auVar188._12_4_ * auVar46._12_4_;
        auVar46 = vsubps_avx(auVar87,auVar134);
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        auVar46 = vshufps_avx(auVar46,auVar46,0xc9);
        auVar135._0_4_ = auVar38._0_4_ * auVar46._0_4_;
        auVar135._4_4_ = auVar38._4_4_ * auVar46._4_4_;
        auVar135._8_4_ = auVar38._8_4_ * auVar46._8_4_;
        auVar135._12_4_ = auVar38._12_4_ * auVar46._12_4_;
        auVar38 = vdpps_avx(auVar43,auVar46,0x7f);
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        auVar88._0_4_ = auVar38._0_4_ * auVar43._0_4_;
        auVar88._4_4_ = auVar38._4_4_ * auVar43._4_4_;
        auVar88._8_4_ = auVar38._8_4_ * auVar43._8_4_;
        auVar88._12_4_ = auVar38._12_4_ * auVar43._12_4_;
        auVar46 = vshufps_avx(auVar188,auVar188,0xff);
        local_308._0_4_ = fVar161 * auVar42._0_4_;
        local_308._4_4_ = fVar57 * auVar42._4_4_;
        fStack_300 = fVar58 * auVar42._8_4_;
        fStack_2fc = fVar59 * auVar42._12_4_;
        auVar43 = vsubps_avx(auVar135,auVar88);
        auVar195._0_4_ = auVar174._0_4_ + (float)local_308._0_4_;
        auVar195._4_4_ = auVar174._4_4_ + (float)local_308._4_4_;
        auVar195._8_4_ = auVar174._8_4_ + fStack_300;
        auVar195._12_4_ = auVar174._12_4_ + fStack_2fc;
        auVar38 = vrcpss_avx(auVar66,auVar66);
        auVar38 = ZEXT416((uint)(auVar38._0_4_ * (2.0 - fVar33 * auVar38._0_4_)));
        auVar38 = vshufps_avx(auVar38,auVar38,0);
        local_328._0_4_ =
             fVar161 * auVar46._0_4_ + auVar42._0_4_ * auVar67._0_4_ * auVar43._0_4_ * auVar38._0_4_
        ;
        local_328._4_4_ =
             fVar57 * auVar46._4_4_ + auVar42._4_4_ * auVar67._4_4_ * auVar43._4_4_ * auVar38._4_4_;
        fStack_320 = fVar58 * auVar46._8_4_ +
                     auVar42._8_4_ * auVar67._8_4_ * auVar43._8_4_ * auVar38._8_4_;
        fStack_31c = fVar59 * auVar46._12_4_ +
                     auVar42._12_4_ * auVar67._12_4_ * auVar43._12_4_ * auVar38._12_4_;
        auVar39._0_4_ = (auVar188._0_4_ + (float)local_328._0_4_) * 0.33333334;
        auVar39._4_4_ = (auVar188._4_4_ + (float)local_328._4_4_) * 0.33333334;
        auVar39._8_4_ = (auVar188._8_4_ + fStack_320) * 0.33333334;
        auVar39._12_4_ = (auVar188._12_4_ + fStack_31c) * 0.33333334;
        auVar43 = vsubps_avx(auVar195,auVar39);
        auVar38 = vshufps_avx(auVar43,auVar43,0xaa);
        fVar161 = auVar38._0_4_;
        fVar33 = auVar38._4_4_;
        fVar57 = auVar38._8_4_;
        fVar58 = auVar38._12_4_;
        auVar38 = vshufps_avx(auVar195,auVar195,0xaa);
        fVar59 = auVar38._0_4_;
        fVar60 = auVar38._4_4_;
        fVar81 = auVar38._8_4_;
        auVar42 = vshufps_avx(auVar190,auVar190,0xaa);
        fVar82 = auVar42._0_4_;
        fVar104 = auVar42._4_4_;
        fVar107 = auVar42._8_4_;
        auVar46 = vshufps_avx(auVar131,auVar131,0xaa);
        fVar114 = auVar46._0_4_;
        fVar115 = auVar46._4_4_;
        fVar130 = auVar46._8_4_;
        fVar83 = auVar46._12_4_;
        auVar138._0_4_ =
             fVar114 * (float)bezier_basis0._476_4_ +
             fVar82 * (float)bezier_basis0._1632_4_ +
             fVar161 * (float)bezier_basis0._2788_4_ + fVar59 * (float)bezier_basis0._3944_4_;
        auVar138._4_4_ =
             fVar115 * (float)bezier_basis0._480_4_ +
             fVar104 * (float)bezier_basis0._1636_4_ +
             fVar33 * (float)bezier_basis0._2792_4_ + fVar60 * (float)bezier_basis0._3948_4_;
        auVar138._8_4_ =
             fVar130 * (float)bezier_basis0._484_4_ +
             fVar107 * (float)bezier_basis0._1640_4_ +
             fVar57 * (float)bezier_basis0._2796_4_ + fVar81 * (float)bezier_basis0._3952_4_;
        auVar138._12_4_ =
             fVar83 * (float)bezier_basis0._488_4_ +
             auVar42._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar58 * (float)bezier_basis0._2800_4_ + auVar38._12_4_ * (float)bezier_basis0._3956_4_
        ;
        auVar138._16_4_ =
             fVar114 * (float)bezier_basis0._492_4_ +
             fVar82 * (float)bezier_basis0._1648_4_ +
             fVar161 * (float)bezier_basis0._2804_4_ + fVar59 * (float)bezier_basis0._3960_4_;
        auVar138._20_4_ =
             fVar115 * (float)bezier_basis0._496_4_ +
             fVar104 * (float)bezier_basis0._1652_4_ +
             fVar33 * (float)bezier_basis0._2808_4_ + fVar60 * (float)bezier_basis0._3964_4_;
        auVar138._24_4_ =
             fVar130 * (float)bezier_basis0._500_4_ +
             fVar107 * (float)bezier_basis0._1656_4_ +
             fVar57 * (float)bezier_basis0._2812_4_ + fVar81 * (float)bezier_basis0._3968_4_;
        auVar138._28_4_ = 0;
        auVar74._8_4_ = 0xff800000;
        auVar74._0_8_ = 0xff800000ff800000;
        auVar74._12_4_ = 0xff800000;
        auVar74._16_4_ = 0xff800000;
        auVar74._20_4_ = 0xff800000;
        auVar74._24_4_ = 0xff800000;
        auVar74._28_4_ = 0xff800000;
        auVar13 = vmaxps_avx(auVar74,auVar138);
        auVar48._0_4_ =
             fVar114 * (float)bezier_basis0._5100_4_ +
             fVar82 * (float)bezier_basis0._6256_4_ +
             fVar161 * (float)bezier_basis0._7412_4_ + fVar59 * (float)bezier_basis0._8568_4_;
        auVar48._4_4_ =
             fVar115 * (float)bezier_basis0._5104_4_ +
             fVar104 * (float)bezier_basis0._6260_4_ +
             fVar33 * (float)bezier_basis0._7416_4_ + fVar60 * (float)bezier_basis0._8572_4_;
        auVar48._8_4_ =
             fVar130 * (float)bezier_basis0._5108_4_ +
             fVar107 * (float)bezier_basis0._6264_4_ +
             fVar57 * (float)bezier_basis0._7420_4_ + fVar81 * (float)bezier_basis0._8576_4_;
        auVar48._12_4_ =
             fVar83 * (float)bezier_basis0._5112_4_ +
             auVar42._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar58 * (float)bezier_basis0._7424_4_ + auVar38._12_4_ * (float)bezier_basis0._8580_4_
        ;
        auVar48._16_4_ =
             fVar114 * (float)bezier_basis0._5116_4_ +
             fVar82 * (float)bezier_basis0._6272_4_ +
             fVar161 * (float)bezier_basis0._7428_4_ + fVar59 * (float)bezier_basis0._8584_4_;
        auVar48._20_4_ =
             fVar115 * (float)bezier_basis0._5120_4_ +
             fVar104 * (float)bezier_basis0._6276_4_ +
             fVar33 * (float)bezier_basis0._7432_4_ + fVar60 * (float)bezier_basis0._8588_4_;
        auVar48._24_4_ =
             fVar130 * (float)bezier_basis0._5124_4_ +
             fVar107 * (float)bezier_basis0._6280_4_ +
             fVar57 * (float)bezier_basis0._7436_4_ + fVar81 * (float)bezier_basis0._8592_4_;
        auVar48._28_4_ = (float)bezier_basis0._6284_4_ + fVar58 + 0.0 + 0.0;
        auVar54 = vblendps_avx(auVar48,ZEXT832(0) << 0x20,1);
        auVar17._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar17._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar17._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar17._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar17._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar17._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar17._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar17._28_4_ = auVar54._28_4_;
        auVar16 = vsubps_avx(auVar138,auVar17);
        auVar54 = vblendps_avx(auVar48,ZEXT832(0) << 0x20,0x80);
        auVar49._0_4_ = auVar138._0_4_ + auVar54._0_4_ * 0.055555556;
        auVar49._4_4_ = auVar138._4_4_ + auVar54._4_4_ * 0.055555556;
        auVar49._8_4_ = auVar138._8_4_ + auVar54._8_4_ * 0.055555556;
        auVar49._12_4_ = auVar138._12_4_ + auVar54._12_4_ * 0.055555556;
        auVar49._16_4_ = auVar138._16_4_ + auVar54._16_4_ * 0.055555556;
        auVar49._20_4_ = auVar138._20_4_ + auVar54._20_4_ * 0.055555556;
        auVar49._24_4_ = auVar138._24_4_ + auVar54._24_4_ * 0.055555556;
        auVar49._28_4_ = auVar54._28_4_ + 0.0;
        auVar54 = vmaxps_avx(auVar16,auVar49);
        auVar13 = vmaxps_avx(auVar13,auVar54);
        auVar38 = vshufps_avx(auVar43,auVar43,0x55);
        auVar42 = vshufps_avx(auVar195,auVar195,0x55);
        fVar161 = auVar38._0_4_;
        fVar58 = auVar38._4_4_;
        fVar81 = auVar38._8_4_;
        fVar107 = auVar38._12_4_;
        fVar33 = auVar42._0_4_;
        fVar59 = auVar42._4_4_;
        fVar82 = auVar42._8_4_;
        fVar114 = auVar42._12_4_;
        auVar38 = vshufps_avx(auVar190,auVar190,0x55);
        fVar57 = auVar38._0_4_;
        fVar60 = auVar38._4_4_;
        fVar104 = auVar38._8_4_;
        auVar42 = vshufps_avx(auVar131,auVar131,0x55);
        fVar115 = auVar42._0_4_;
        fVar130 = auVar42._4_4_;
        fVar100 = auVar42._8_4_;
        auVar175._0_4_ =
             fVar115 * (float)bezier_basis0._476_4_ +
             (float)bezier_basis0._1632_4_ * fVar57 +
             (float)bezier_basis0._2788_4_ * fVar161 + (float)bezier_basis0._3944_4_ * fVar33;
        auVar175._4_4_ =
             fVar130 * (float)bezier_basis0._480_4_ +
             (float)bezier_basis0._1636_4_ * fVar60 +
             (float)bezier_basis0._2792_4_ * fVar58 + (float)bezier_basis0._3948_4_ * fVar59;
        auVar175._8_4_ =
             fVar100 * (float)bezier_basis0._484_4_ +
             (float)bezier_basis0._1640_4_ * fVar104 +
             (float)bezier_basis0._2796_4_ * fVar81 + (float)bezier_basis0._3952_4_ * fVar82;
        auVar175._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._488_4_ +
             (float)bezier_basis0._1644_4_ * auVar38._12_4_ +
             (float)bezier_basis0._2800_4_ * fVar107 + (float)bezier_basis0._3956_4_ * fVar114;
        auVar175._16_4_ =
             fVar115 * (float)bezier_basis0._492_4_ +
             (float)bezier_basis0._1648_4_ * fVar57 +
             (float)bezier_basis0._2804_4_ * fVar161 + (float)bezier_basis0._3960_4_ * fVar33;
        auVar175._20_4_ =
             fVar130 * (float)bezier_basis0._496_4_ +
             (float)bezier_basis0._1652_4_ * fVar60 +
             (float)bezier_basis0._2808_4_ * fVar58 + (float)bezier_basis0._3964_4_ * fVar59;
        auVar175._24_4_ =
             fVar100 * (float)bezier_basis0._500_4_ +
             (float)bezier_basis0._1656_4_ * fVar104 +
             (float)bezier_basis0._2812_4_ * fVar81 + (float)bezier_basis0._3968_4_ * fVar82;
        auVar175._28_4_ =
             (float)bezier_basis0._1660_4_ + (float)bezier_basis0._3972_4_ + fVar83 + 0.0;
        auVar75._0_4_ =
             fVar115 * (float)bezier_basis0._5100_4_ +
             (float)bezier_basis0._6256_4_ * fVar57 +
             fVar161 * (float)bezier_basis0._7412_4_ + fVar33 * (float)bezier_basis0._8568_4_;
        auVar75._4_4_ =
             fVar130 * (float)bezier_basis0._5104_4_ +
             (float)bezier_basis0._6260_4_ * fVar60 +
             fVar58 * (float)bezier_basis0._7416_4_ + fVar59 * (float)bezier_basis0._8572_4_;
        auVar75._8_4_ =
             fVar100 * (float)bezier_basis0._5108_4_ +
             (float)bezier_basis0._6264_4_ * fVar104 +
             fVar81 * (float)bezier_basis0._7420_4_ + fVar82 * (float)bezier_basis0._8576_4_;
        auVar75._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
             (float)bezier_basis0._6268_4_ * auVar38._12_4_ +
             fVar107 * (float)bezier_basis0._7424_4_ + fVar114 * (float)bezier_basis0._8580_4_;
        auVar75._16_4_ =
             fVar115 * (float)bezier_basis0._5116_4_ +
             (float)bezier_basis0._6272_4_ * fVar57 +
             fVar161 * (float)bezier_basis0._7428_4_ + fVar33 * (float)bezier_basis0._8584_4_;
        auVar75._20_4_ =
             fVar130 * (float)bezier_basis0._5120_4_ +
             (float)bezier_basis0._6276_4_ * fVar60 +
             fVar58 * (float)bezier_basis0._7432_4_ + fVar59 * (float)bezier_basis0._8588_4_;
        auVar75._24_4_ =
             fVar100 * (float)bezier_basis0._5124_4_ +
             (float)bezier_basis0._6280_4_ * fVar104 +
             fVar81 * (float)bezier_basis0._7436_4_ + fVar82 * (float)bezier_basis0._8592_4_;
        auVar75._28_4_ = fVar114 + fVar114 + fVar107 + fVar114;
        auVar54 = vblendps_avx(auVar75,ZEXT832(0) << 0x20,1);
        auVar20._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar20._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar20._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar20._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar20._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar20._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar20._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar20._28_4_ = auVar54._28_4_;
        auVar17 = vsubps_avx(auVar175,auVar20);
        auVar54 = vblendps_avx(auVar75,ZEXT832(0) << 0x20,0x80);
        auVar76._0_4_ = auVar175._0_4_ + auVar54._0_4_ * 0.055555556;
        auVar76._4_4_ = auVar175._4_4_ + auVar54._4_4_ * 0.055555556;
        auVar76._8_4_ = auVar175._8_4_ + auVar54._8_4_ * 0.055555556;
        auVar76._12_4_ = auVar175._12_4_ + auVar54._12_4_ * 0.055555556;
        auVar76._16_4_ = auVar175._16_4_ + auVar54._16_4_ * 0.055555556;
        auVar76._20_4_ = auVar175._20_4_ + auVar54._20_4_ * 0.055555556;
        auVar76._24_4_ = auVar175._24_4_ + auVar54._24_4_ * 0.055555556;
        auVar76._28_4_ = auVar175._28_4_ + auVar54._28_4_;
        auVar158._8_4_ = 0xff800000;
        auVar158._0_8_ = 0xff800000ff800000;
        auVar158._12_4_ = 0xff800000;
        auVar158._16_4_ = 0xff800000;
        auVar158._20_4_ = 0xff800000;
        auVar158._24_4_ = 0xff800000;
        auVar158._28_4_ = 0xff800000;
        auVar54 = vmaxps_avx(auVar158,auVar175);
        auVar14 = vmaxps_avx(auVar17,auVar76);
        auVar53 = vmaxps_avx(auVar54,auVar14);
        auVar38 = vshufps_avx(auVar43,auVar43,0);
        auVar42 = vshufps_avx(auVar195,auVar195,0);
        fVar59 = auVar38._0_4_;
        fVar60 = auVar38._4_4_;
        fVar81 = auVar38._8_4_;
        fVar82 = auVar38._12_4_;
        fVar104 = auVar42._0_4_;
        fVar107 = auVar42._4_4_;
        fVar114 = auVar42._8_4_;
        fVar115 = auVar42._12_4_;
        auVar38 = vpermilps_avx(auVar190,0);
        fVar130 = auVar38._0_4_;
        fVar83 = auVar38._4_4_;
        fVar100 = auVar38._8_4_;
        auVar42 = vpermilps_avx(auVar131,0);
        fVar161 = auVar42._0_4_;
        fVar33 = auVar42._4_4_;
        fVar57 = auVar42._8_4_;
        fVar58 = auVar42._12_4_;
        auVar182._0_4_ =
             (float)bezier_basis0._476_4_ * fVar161 +
             fVar130 * (float)bezier_basis0._1632_4_ +
             fVar59 * (float)bezier_basis0._2788_4_ + fVar104 * (float)bezier_basis0._3944_4_;
        auVar182._4_4_ =
             (float)bezier_basis0._480_4_ * fVar33 +
             fVar83 * (float)bezier_basis0._1636_4_ +
             fVar60 * (float)bezier_basis0._2792_4_ + fVar107 * (float)bezier_basis0._3948_4_;
        auVar182._8_4_ =
             (float)bezier_basis0._484_4_ * fVar57 +
             fVar100 * (float)bezier_basis0._1640_4_ +
             fVar81 * (float)bezier_basis0._2796_4_ + fVar114 * (float)bezier_basis0._3952_4_;
        auVar182._12_4_ =
             (float)bezier_basis0._488_4_ * fVar58 +
             auVar38._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar82 * (float)bezier_basis0._2800_4_ + fVar115 * (float)bezier_basis0._3956_4_;
        auVar182._16_4_ =
             (float)bezier_basis0._492_4_ * fVar161 +
             fVar130 * (float)bezier_basis0._1648_4_ +
             fVar59 * (float)bezier_basis0._2804_4_ + fVar104 * (float)bezier_basis0._3960_4_;
        auVar182._20_4_ =
             (float)bezier_basis0._496_4_ * fVar33 +
             fVar83 * (float)bezier_basis0._1652_4_ +
             fVar60 * (float)bezier_basis0._2808_4_ + fVar107 * (float)bezier_basis0._3964_4_;
        auVar182._24_4_ =
             (float)bezier_basis0._500_4_ * fVar57 +
             fVar100 * (float)bezier_basis0._1656_4_ +
             fVar81 * (float)bezier_basis0._2812_4_ + fVar114 * (float)bezier_basis0._3968_4_;
        auVar182._28_4_ =
             (float)bezier_basis0._6284_4_ +
             (float)bezier_basis0._6284_4_ + auVar14._28_4_ + (float)bezier_basis0._1660_4_;
        auVar144._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar161 +
             fVar130 * (float)bezier_basis0._6256_4_ +
             fVar104 * (float)bezier_basis0._8568_4_ + fVar59 * (float)bezier_basis0._7412_4_;
        auVar144._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar33 +
             fVar83 * (float)bezier_basis0._6260_4_ +
             fVar107 * (float)bezier_basis0._8572_4_ + fVar60 * (float)bezier_basis0._7416_4_;
        auVar144._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar57 +
             fVar100 * (float)bezier_basis0._6264_4_ +
             fVar114 * (float)bezier_basis0._8576_4_ + fVar81 * (float)bezier_basis0._7420_4_;
        auVar144._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar58 +
             auVar38._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar115 * (float)bezier_basis0._8580_4_ + fVar82 * (float)bezier_basis0._7424_4_;
        auVar144._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar161 +
             fVar130 * (float)bezier_basis0._6272_4_ +
             fVar104 * (float)bezier_basis0._8584_4_ + fVar59 * (float)bezier_basis0._7428_4_;
        auVar144._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar33 +
             fVar83 * (float)bezier_basis0._6276_4_ +
             fVar107 * (float)bezier_basis0._8588_4_ + fVar60 * (float)bezier_basis0._7432_4_;
        auVar144._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar57 +
             fVar100 * (float)bezier_basis0._6280_4_ +
             fVar114 * (float)bezier_basis0._8592_4_ + fVar81 * (float)bezier_basis0._7436_4_;
        auVar144._28_4_ = fVar58 + fVar115 + fVar115 + fVar82;
        auVar54 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,1);
        auVar21._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar21._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar21._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar21._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar21._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar21._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar21._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar21._28_4_ = auVar54._28_4_;
        auVar96 = vsubps_avx(auVar182,auVar21);
        auVar54 = vblendps_avx(auVar144,ZEXT832(0) << 0x20,0x80);
        auVar145._0_4_ = auVar182._0_4_ + auVar54._0_4_ * 0.055555556;
        auVar145._4_4_ = auVar182._4_4_ + auVar54._4_4_ * 0.055555556;
        auVar145._8_4_ = auVar182._8_4_ + auVar54._8_4_ * 0.055555556;
        auVar145._12_4_ = auVar182._12_4_ + auVar54._12_4_ * 0.055555556;
        auVar145._16_4_ = auVar182._16_4_ + auVar54._16_4_ * 0.055555556;
        auVar145._20_4_ = auVar182._20_4_ + auVar54._20_4_ * 0.055555556;
        auVar145._24_4_ = auVar182._24_4_ + auVar54._24_4_ * 0.055555556;
        auVar145._28_4_ = auVar182._28_4_ + auVar54._28_4_;
        auVar50._8_4_ = 0xff800000;
        auVar50._0_8_ = 0xff800000ff800000;
        auVar50._12_4_ = 0xff800000;
        auVar50._16_4_ = 0xff800000;
        auVar50._20_4_ = 0xff800000;
        auVar50._24_4_ = 0xff800000;
        auVar50._28_4_ = 0xff800000;
        auVar54 = vmaxps_avx(auVar50,auVar182);
        auVar14 = vmaxps_avx(auVar96,auVar145);
        auVar14 = vmaxps_avx(auVar54,auVar14);
        auVar16 = vminps_avx(auVar16,auVar49);
        auVar194._8_4_ = 0x7f800000;
        auVar194._0_8_ = 0x7f8000007f800000;
        auVar194._12_4_ = 0x7f800000;
        auVar194._16_4_ = 0x7f800000;
        auVar194._20_4_ = 0x7f800000;
        auVar194._24_4_ = 0x7f800000;
        auVar194._28_4_ = 0x7f800000;
        auVar15 = vminps_avx(auVar194,auVar138);
        auVar15 = vminps_avx(auVar15,auVar16);
        auVar16 = vminps_avx(auVar17,auVar76);
        auVar17 = vminps_avx(auVar194,auVar175);
        auVar17 = vminps_avx(auVar17,auVar16);
        auVar16 = vminps_avx(auVar194,auVar182);
        auVar96 = vminps_avx(auVar96,auVar145);
        auVar96 = vminps_avx(auVar16,auVar96);
        auVar67 = vsubps_avx(auVar189,_local_108);
        auVar38 = vshufps_avx(auVar67,auVar67,0);
        auVar42 = vsubps_avx(auVar72,_local_148);
        auVar40._0_4_ = auVar67._0_4_ + auVar42._0_4_ * 0.33333334;
        auVar40._4_4_ = auVar67._4_4_ + auVar42._4_4_ * 0.33333334;
        auVar40._8_4_ = auVar67._8_4_ + auVar42._8_4_ * 0.33333334;
        auVar40._12_4_ = auVar67._12_4_ + auVar42._12_4_ * 0.33333334;
        auVar42 = vshufps_avx(auVar40,auVar40,0);
        auVar72 = vsubps_avx(auVar174,_local_308);
        auVar46 = vsubps_avx(auVar188,_local_328);
        auVar41._0_4_ = auVar46._0_4_ * 0.33333334;
        auVar41._4_4_ = auVar46._4_4_ * 0.33333334;
        auVar41._8_4_ = auVar46._8_4_ * 0.33333334;
        auVar41._12_4_ = auVar46._12_4_ * 0.33333334;
        auVar47 = vsubps_avx(auVar72,auVar41);
        auVar46 = vshufps_avx(auVar47,auVar47,0);
        fVar161 = auVar46._0_4_;
        fVar58 = auVar46._4_4_;
        fVar81 = auVar46._8_4_;
        fVar107 = auVar46._12_4_;
        auVar46 = vshufps_avx(auVar72,auVar72,0);
        fVar33 = auVar46._0_4_;
        fVar59 = auVar46._4_4_;
        fVar82 = auVar46._8_4_;
        fVar114 = auVar46._12_4_;
        fVar130 = auVar54._28_4_;
        fVar83 = auVar42._0_4_;
        fVar100 = auVar42._4_4_;
        fVar102 = auVar42._8_4_;
        fVar105 = auVar42._12_4_;
        fVar57 = auVar38._0_4_;
        fVar60 = auVar38._4_4_;
        fVar104 = auVar38._8_4_;
        fVar115 = auVar38._12_4_;
        auVar176._0_4_ =
             (float)bezier_basis0._476_4_ * fVar57 +
             fVar83 * (float)bezier_basis0._1632_4_ +
             (float)bezier_basis0._3944_4_ * fVar33 + (float)bezier_basis0._2788_4_ * fVar161;
        auVar176._4_4_ =
             (float)bezier_basis0._480_4_ * fVar60 +
             fVar100 * (float)bezier_basis0._1636_4_ +
             (float)bezier_basis0._3948_4_ * fVar59 + (float)bezier_basis0._2792_4_ * fVar58;
        auVar176._8_4_ =
             (float)bezier_basis0._484_4_ * fVar104 +
             fVar102 * (float)bezier_basis0._1640_4_ +
             (float)bezier_basis0._3952_4_ * fVar82 + (float)bezier_basis0._2796_4_ * fVar81;
        auVar176._12_4_ =
             (float)bezier_basis0._488_4_ * fVar115 +
             fVar105 * (float)bezier_basis0._1644_4_ +
             (float)bezier_basis0._3956_4_ * fVar114 + (float)bezier_basis0._2800_4_ * fVar107;
        auVar176._16_4_ =
             (float)bezier_basis0._492_4_ * fVar57 +
             fVar83 * (float)bezier_basis0._1648_4_ +
             (float)bezier_basis0._3960_4_ * fVar33 + (float)bezier_basis0._2804_4_ * fVar161;
        auVar176._20_4_ =
             (float)bezier_basis0._496_4_ * fVar60 +
             fVar100 * (float)bezier_basis0._1652_4_ +
             (float)bezier_basis0._3964_4_ * fVar59 + (float)bezier_basis0._2808_4_ * fVar58;
        auVar176._24_4_ =
             (float)bezier_basis0._500_4_ * fVar104 +
             fVar102 * (float)bezier_basis0._1656_4_ +
             (float)bezier_basis0._3968_4_ * fVar82 + (float)bezier_basis0._2812_4_ * fVar81;
        auVar176._28_4_ = fVar130 + fVar130 + fVar130 + 0.0;
        auVar51._8_4_ = 0xff800000;
        auVar51._0_8_ = 0xff800000ff800000;
        auVar51._12_4_ = 0xff800000;
        auVar51._16_4_ = 0xff800000;
        auVar51._20_4_ = 0xff800000;
        auVar51._24_4_ = 0xff800000;
        auVar51._28_4_ = 0xff800000;
        auVar16 = vmaxps_avx(auVar51,auVar176);
        auVar92._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar57 +
             (float)bezier_basis0._6256_4_ * fVar83 +
             fVar161 * (float)bezier_basis0._7412_4_ + fVar33 * (float)bezier_basis0._8568_4_;
        auVar92._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar60 +
             (float)bezier_basis0._6260_4_ * fVar100 +
             fVar58 * (float)bezier_basis0._7416_4_ + fVar59 * (float)bezier_basis0._8572_4_;
        auVar92._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar104 +
             (float)bezier_basis0._6264_4_ * fVar102 +
             fVar81 * (float)bezier_basis0._7420_4_ + fVar82 * (float)bezier_basis0._8576_4_;
        auVar92._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar115 +
             (float)bezier_basis0._6268_4_ * fVar105 +
             fVar107 * (float)bezier_basis0._7424_4_ + fVar114 * (float)bezier_basis0._8580_4_;
        auVar92._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar57 +
             (float)bezier_basis0._6272_4_ * fVar83 +
             fVar161 * (float)bezier_basis0._7428_4_ + fVar33 * (float)bezier_basis0._8584_4_;
        auVar92._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar60 +
             (float)bezier_basis0._6276_4_ * fVar100 +
             fVar58 * (float)bezier_basis0._7432_4_ + fVar59 * (float)bezier_basis0._8588_4_;
        auVar92._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar104 +
             (float)bezier_basis0._6280_4_ * fVar102 +
             fVar81 * (float)bezier_basis0._7436_4_ + fVar82 * (float)bezier_basis0._8592_4_;
        auVar92._28_4_ = fVar115 + fVar105 + fVar107 + fVar114;
        auVar54 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,1);
        auVar22._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar22._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar22._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar22._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar22._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar22._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar22._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar22._28_4_ = auVar54._28_4_;
        auVar55 = vsubps_avx(auVar176,auVar22);
        auVar54 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
        auVar93._0_4_ = auVar176._0_4_ + auVar54._0_4_ * 0.055555556;
        auVar93._4_4_ = auVar176._4_4_ + auVar54._4_4_ * 0.055555556;
        auVar93._8_4_ = auVar176._8_4_ + auVar54._8_4_ * 0.055555556;
        auVar93._12_4_ = auVar176._12_4_ + auVar54._12_4_ * 0.055555556;
        auVar93._16_4_ = auVar176._16_4_ + auVar54._16_4_ * 0.055555556;
        auVar93._20_4_ = auVar176._20_4_ + auVar54._20_4_ * 0.055555556;
        auVar93._24_4_ = auVar176._24_4_ + auVar54._24_4_ * 0.055555556;
        auVar93._28_4_ = auVar176._28_4_ + auVar54._28_4_;
        auVar54 = vmaxps_avx(auVar55,auVar93);
        auVar54 = vmaxps_avx(auVar16,auVar54);
        auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar38 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar42 = vshufps_avx(auVar47,auVar47,0x55);
        auVar46 = vshufps_avx(auVar72,auVar72,0x55);
        fVar161 = auVar42._0_4_;
        fVar33 = auVar42._4_4_;
        fVar57 = auVar42._8_4_;
        fVar58 = auVar42._12_4_;
        fVar59 = auVar46._0_4_;
        fVar60 = auVar46._4_4_;
        fVar81 = auVar46._8_4_;
        auVar42 = vshufps_avx(auVar40,auVar40,0x55);
        fVar82 = auVar42._0_4_;
        fVar104 = auVar42._4_4_;
        fVar107 = auVar42._8_4_;
        auVar43 = vshufps_avx(auVar67,auVar67,0x55);
        fVar114 = auVar43._0_4_;
        fVar115 = auVar43._4_4_;
        fVar130 = auVar43._8_4_;
        auVar121._0_4_ =
             fVar114 * (float)bezier_basis0._476_4_ +
             fVar82 * (float)bezier_basis0._1632_4_ +
             fVar59 * (float)bezier_basis0._3944_4_ + fVar161 * (float)bezier_basis0._2788_4_;
        auVar121._4_4_ =
             fVar115 * (float)bezier_basis0._480_4_ +
             fVar104 * (float)bezier_basis0._1636_4_ +
             fVar60 * (float)bezier_basis0._3948_4_ + fVar33 * (float)bezier_basis0._2792_4_;
        auVar121._8_4_ =
             fVar130 * (float)bezier_basis0._484_4_ +
             fVar107 * (float)bezier_basis0._1640_4_ +
             fVar81 * (float)bezier_basis0._3952_4_ + fVar57 * (float)bezier_basis0._2796_4_;
        auVar121._12_4_ =
             auVar43._12_4_ * (float)bezier_basis0._488_4_ +
             auVar42._12_4_ * (float)bezier_basis0._1644_4_ +
             auVar46._12_4_ * (float)bezier_basis0._3956_4_ + fVar58 * (float)bezier_basis0._2800_4_
        ;
        auVar121._16_4_ =
             fVar114 * (float)bezier_basis0._492_4_ +
             fVar82 * (float)bezier_basis0._1648_4_ +
             fVar59 * (float)bezier_basis0._3960_4_ + fVar161 * (float)bezier_basis0._2804_4_;
        auVar121._20_4_ =
             fVar115 * (float)bezier_basis0._496_4_ +
             fVar104 * (float)bezier_basis0._1652_4_ +
             fVar60 * (float)bezier_basis0._3964_4_ + fVar33 * (float)bezier_basis0._2808_4_;
        auVar121._24_4_ =
             fVar130 * (float)bezier_basis0._500_4_ +
             fVar107 * (float)bezier_basis0._1656_4_ +
             fVar81 * (float)bezier_basis0._3968_4_ + fVar57 * (float)bezier_basis0._2812_4_;
        auVar121._28_4_ =
             (float)bezier_basis0._1660_4_ +
             (float)bezier_basis0._6284_4_ + (float)bezier_basis0._2816_4_ + 0.0;
        auVar139._0_4_ =
             fVar114 * (float)bezier_basis0._5100_4_ +
             fVar82 * (float)bezier_basis0._6256_4_ +
             fVar59 * (float)bezier_basis0._8568_4_ + fVar161 * (float)bezier_basis0._7412_4_;
        auVar139._4_4_ =
             fVar115 * (float)bezier_basis0._5104_4_ +
             fVar104 * (float)bezier_basis0._6260_4_ +
             fVar60 * (float)bezier_basis0._8572_4_ + fVar33 * (float)bezier_basis0._7416_4_;
        auVar139._8_4_ =
             fVar130 * (float)bezier_basis0._5108_4_ +
             fVar107 * (float)bezier_basis0._6264_4_ +
             fVar81 * (float)bezier_basis0._8576_4_ + fVar57 * (float)bezier_basis0._7420_4_;
        auVar139._12_4_ =
             auVar43._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar42._12_4_ * (float)bezier_basis0._6268_4_ +
             auVar46._12_4_ * (float)bezier_basis0._8580_4_ + fVar58 * (float)bezier_basis0._7424_4_
        ;
        auVar139._16_4_ =
             fVar114 * (float)bezier_basis0._5116_4_ +
             fVar82 * (float)bezier_basis0._6272_4_ +
             fVar59 * (float)bezier_basis0._8584_4_ + fVar161 * (float)bezier_basis0._7428_4_;
        auVar139._20_4_ =
             fVar115 * (float)bezier_basis0._5120_4_ +
             fVar104 * (float)bezier_basis0._6276_4_ +
             fVar60 * (float)bezier_basis0._8588_4_ + fVar33 * (float)bezier_basis0._7432_4_;
        auVar139._24_4_ =
             fVar130 * (float)bezier_basis0._5124_4_ +
             fVar107 * (float)bezier_basis0._6280_4_ +
             fVar81 * (float)bezier_basis0._8592_4_ + fVar57 * (float)bezier_basis0._7436_4_;
        auVar139._28_4_ = fVar58 + fVar58 + fVar58 + (float)bezier_basis0._1660_4_;
        auVar54 = vblendps_avx(auVar139,ZEXT832(0) << 0x20,1);
        auVar23._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar23._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar23._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar23._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar23._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar23._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar23._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar23._28_4_ = auVar54._28_4_;
        auVar18 = vsubps_avx(auVar121,auVar23);
        auVar54 = vblendps_avx(auVar139,ZEXT832(0) << 0x20,0x80);
        auVar177._0_4_ = auVar121._0_4_ + auVar54._0_4_ * 0.055555556;
        auVar177._4_4_ = auVar121._4_4_ + auVar54._4_4_ * 0.055555556;
        auVar177._8_4_ = auVar121._8_4_ + auVar54._8_4_ * 0.055555556;
        auVar177._12_4_ = auVar121._12_4_ + auVar54._12_4_ * 0.055555556;
        auVar177._16_4_ = auVar121._16_4_ + auVar54._16_4_ * 0.055555556;
        auVar177._20_4_ = auVar121._20_4_ + auVar54._20_4_ * 0.055555556;
        auVar177._24_4_ = auVar121._24_4_ + auVar54._24_4_ * 0.055555556;
        auVar177._28_4_ = auVar121._28_4_ + auVar54._28_4_;
        auVar140._8_4_ = 0xff800000;
        auVar140._0_8_ = 0xff800000ff800000;
        auVar140._12_4_ = 0xff800000;
        auVar140._16_4_ = 0xff800000;
        auVar140._20_4_ = 0xff800000;
        auVar140._24_4_ = 0xff800000;
        auVar140._28_4_ = 0xff800000;
        auVar54 = vmaxps_avx(auVar140,auVar121);
        auVar16 = vmaxps_avx(auVar18,auVar177);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar46 = vunpcklps_avx(auVar38,auVar42);
        auVar38 = vshufps_avx(auVar47,auVar47,0xaa);
        auVar42 = vshufps_avx(auVar72,auVar72,0xaa);
        fVar161 = auVar38._0_4_;
        fVar33 = auVar38._4_4_;
        fVar57 = auVar38._8_4_;
        fVar58 = auVar38._12_4_;
        fVar59 = auVar42._0_4_;
        fVar60 = auVar42._4_4_;
        fVar81 = auVar42._8_4_;
        fVar82 = auVar42._12_4_;
        auVar38 = vshufps_avx(auVar40,auVar40,0xaa);
        fVar104 = auVar38._0_4_;
        fVar107 = auVar38._4_4_;
        fVar114 = auVar38._8_4_;
        auVar42 = vshufps_avx(auVar67,auVar67,0xaa);
        fVar115 = auVar42._0_4_;
        fVar130 = auVar42._4_4_;
        fVar83 = auVar42._8_4_;
        auVar94._0_4_ =
             fVar115 * (float)bezier_basis0._476_4_ +
             fVar104 * (float)bezier_basis0._1632_4_ +
             fVar59 * (float)bezier_basis0._3944_4_ + fVar161 * (float)bezier_basis0._2788_4_;
        auVar94._4_4_ =
             fVar130 * (float)bezier_basis0._480_4_ +
             fVar107 * (float)bezier_basis0._1636_4_ +
             fVar60 * (float)bezier_basis0._3948_4_ + fVar33 * (float)bezier_basis0._2792_4_;
        auVar94._8_4_ =
             fVar83 * (float)bezier_basis0._484_4_ +
             fVar114 * (float)bezier_basis0._1640_4_ +
             fVar81 * (float)bezier_basis0._3952_4_ + fVar57 * (float)bezier_basis0._2796_4_;
        auVar94._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._488_4_ +
             auVar38._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar82 * (float)bezier_basis0._3956_4_ + fVar58 * (float)bezier_basis0._2800_4_;
        auVar94._16_4_ =
             fVar115 * (float)bezier_basis0._492_4_ +
             fVar104 * (float)bezier_basis0._1648_4_ +
             fVar59 * (float)bezier_basis0._3960_4_ + fVar161 * (float)bezier_basis0._2804_4_;
        auVar94._20_4_ =
             fVar130 * (float)bezier_basis0._496_4_ +
             fVar107 * (float)bezier_basis0._1652_4_ +
             fVar60 * (float)bezier_basis0._3964_4_ + fVar33 * (float)bezier_basis0._2808_4_;
        auVar94._24_4_ =
             fVar83 * (float)bezier_basis0._500_4_ +
             fVar114 * (float)bezier_basis0._1656_4_ +
             fVar81 * (float)bezier_basis0._3968_4_ + fVar57 * (float)bezier_basis0._2812_4_;
        auVar94._28_4_ = (float)bezier_basis0._504_4_ + (float)bezier_basis0._5128_4_ + 0.0 + 0.0;
        auVar141._0_4_ =
             fVar115 * (float)bezier_basis0._5100_4_ +
             fVar104 * (float)bezier_basis0._6256_4_ +
             fVar161 * (float)bezier_basis0._7412_4_ + fVar59 * (float)bezier_basis0._8568_4_;
        auVar141._4_4_ =
             fVar130 * (float)bezier_basis0._5104_4_ +
             fVar107 * (float)bezier_basis0._6260_4_ +
             fVar33 * (float)bezier_basis0._7416_4_ + fVar60 * (float)bezier_basis0._8572_4_;
        auVar141._8_4_ =
             fVar83 * (float)bezier_basis0._5108_4_ +
             fVar114 * (float)bezier_basis0._6264_4_ +
             fVar57 * (float)bezier_basis0._7420_4_ + fVar81 * (float)bezier_basis0._8576_4_;
        auVar141._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar38._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar58 * (float)bezier_basis0._7424_4_ + fVar82 * (float)bezier_basis0._8580_4_;
        auVar141._16_4_ =
             fVar115 * (float)bezier_basis0._5116_4_ +
             fVar104 * (float)bezier_basis0._6272_4_ +
             fVar161 * (float)bezier_basis0._7428_4_ + fVar59 * (float)bezier_basis0._8584_4_;
        auVar141._20_4_ =
             fVar130 * (float)bezier_basis0._5120_4_ +
             fVar107 * (float)bezier_basis0._6276_4_ +
             fVar33 * (float)bezier_basis0._7432_4_ + fVar60 * (float)bezier_basis0._8588_4_;
        auVar141._24_4_ =
             fVar83 * (float)bezier_basis0._5124_4_ +
             fVar114 * (float)bezier_basis0._6280_4_ +
             fVar57 * (float)bezier_basis0._7436_4_ + fVar81 * (float)bezier_basis0._8592_4_;
        auVar141._28_4_ = fVar82 + fVar82 + fVar58 + fVar82;
        auVar54 = vblendps_avx(auVar141,ZEXT832(0) << 0x20,1);
        auVar24._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar24._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar24._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar24._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar24._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar24._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar24._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar24._28_4_ = auVar54._28_4_;
        auVar19 = vsubps_avx(auVar94,auVar24);
        auVar54 = vblendps_avx(auVar141,ZEXT832(0) << 0x20,0x80);
        auVar183._0_4_ = auVar94._0_4_ + auVar54._0_4_ * 0.055555556;
        auVar183._4_4_ = auVar94._4_4_ + auVar54._4_4_ * 0.055555556;
        auVar183._8_4_ = auVar94._8_4_ + auVar54._8_4_ * 0.055555556;
        auVar183._12_4_ = auVar94._12_4_ + auVar54._12_4_ * 0.055555556;
        auVar183._16_4_ = auVar94._16_4_ + auVar54._16_4_ * 0.055555556;
        auVar183._20_4_ = auVar94._20_4_ + auVar54._20_4_ * 0.055555556;
        auVar183._24_4_ = auVar94._24_4_ + auVar54._24_4_ * 0.055555556;
        auVar183._28_4_ = auVar94._28_4_ + auVar54._28_4_;
        auVar52._8_4_ = 0xff800000;
        auVar52._0_8_ = 0xff800000ff800000;
        auVar52._12_4_ = 0xff800000;
        auVar52._16_4_ = 0xff800000;
        auVar52._20_4_ = 0xff800000;
        auVar52._24_4_ = 0xff800000;
        auVar52._28_4_ = 0xff800000;
        auVar54 = vmaxps_avx(auVar52,auVar94);
        auVar16 = vmaxps_avx(auVar19,auVar183);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar16);
        auVar38 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar38 = vinsertps_avx(auVar46,auVar38,0x28);
        auVar54 = vminps_avx(auVar55,auVar93);
        auVar142._8_4_ = 0x7f800000;
        auVar142._0_8_ = 0x7f8000007f800000;
        auVar142._12_4_ = 0x7f800000;
        auVar142._16_4_ = 0x7f800000;
        auVar142._20_4_ = 0x7f800000;
        auVar142._24_4_ = 0x7f800000;
        auVar142._28_4_ = 0x7f800000;
        auVar16 = vminps_avx(auVar142,auVar176);
        auVar54 = vminps_avx(auVar16,auVar54);
        auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar42 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar54 = vminps_avx(auVar18,auVar177);
        auVar16 = vminps_avx(auVar142,auVar121);
        auVar54 = vminps_avx(auVar16,auVar54);
        auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar46 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar46 = vunpcklps_avx(auVar42,auVar46);
        auVar54 = vminps_avx(auVar19,auVar183);
        auVar165._8_4_ = 0xddccb9a2;
        auVar165._0_8_ = 0xddccb9a2ddccb9a2;
        auVar165._12_4_ = 0xddccb9a2;
        auVar168 = ZEXT1664(auVar165);
        auVar16 = vminps_avx(auVar142,auVar94);
        auVar54 = vminps_avx(auVar16,auVar54);
        auVar16 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar42 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar42 = vinsertps_avx(auVar46,auVar42,0x28);
        auVar54 = vshufps_avx(auVar96,auVar96,0xb1);
        auVar54 = vminps_avx(auVar96,auVar54);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar46 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar54 = vshufps_avx(auVar17,auVar17,0xb1);
        auVar54 = vminps_avx(auVar17,auVar54);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar43 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar43 = vunpcklps_avx(auVar46,auVar43);
        auVar54 = vshufps_avx(auVar15,auVar15,0xb1);
        auVar54 = vminps_avx(auVar15,auVar54);
        auVar16 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vminps_avx(auVar54,auVar16);
        auVar46 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar46 = vinsertps_avx(auVar43,auVar46,0x28);
        auVar43 = vminps_avx(auVar42,auVar46);
        auVar54 = vshufps_avx(auVar14,auVar14,0xb1);
        auVar54 = vmaxps_avx(auVar14,auVar54);
        auVar14 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar14);
        auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar54 = vshufps_avx(auVar53,auVar53,0xb1);
        auVar54 = vmaxps_avx(auVar53,auVar54);
        auVar14 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar14);
        auVar46 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar46 = vunpcklps_avx(auVar42,auVar46);
        auVar54 = vshufps_avx(auVar13,auVar13,0xb1);
        auVar54 = vmaxps_avx(auVar13,auVar54);
        auVar13 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar13);
        auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar42 = vinsertps_avx(auVar46,auVar42,0x28);
        auVar42 = vmaxps_avx(auVar38,auVar42);
        auVar153._8_4_ = 0x5dccb9a2;
        auVar153._0_8_ = 0x5dccb9a25dccb9a2;
        auVar153._12_4_ = 0x5dccb9a2;
        auVar160 = ZEXT1664(auVar153);
        auVar38 = vcmpps_avx(auVar43,auVar165,6);
        auVar42 = vcmpps_avx(auVar42,auVar153,1);
        auVar38 = vandps_avx(auVar42,auVar38);
        uVar26 = vmovmskps_avx(auVar38);
        lVar28 = lVar28 + 0x38;
      } while ((~(byte)uVar26 & 7) == 0);
    }
    uVar29 = uVar29 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }